

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_intersector.h
# Opt level: O2

bool embree::avx512::CurveNiIntersector1<4>::
     occluded_hn<embree::avx512::OrientedCurve1Intersector1<embree::HermiteCurveT,7,8>,embree::avx512::Occluded1Epilog1<true>>
               (Precalculations *pre,Ray *ray,RayQueryContext *context,Primitive *prim)

{
  ulong uVar1;
  anon_union_16_2_47237d3f_for_Vec3fx_0 aVar2;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar3;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar4;
  uint uVar5;
  uint uVar6;
  Geometry *pGVar7;
  long lVar8;
  __int_type_conflict _Var9;
  RTCFilterFunctionN p_Var10;
  undefined8 uVar11;
  undefined8 uVar12;
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  bool bVar20;
  byte bVar21;
  uint uVar22;
  ulong uVar23;
  long lVar25;
  uint uVar26;
  ulong uVar27;
  undefined8 unaff_RBP;
  ulong uVar28;
  bool bVar29;
  bool bVar30;
  bool bVar31;
  bool bVar32;
  bool bVar33;
  bool bVar34;
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 in_YmmResult [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  undefined1 auVar72 [32];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar73 [32];
  undefined1 auVar74 [32];
  undefined1 auVar75 [32];
  undefined1 auVar76 [32];
  undefined1 auVar78 [32];
  undefined1 auVar80 [32];
  undefined1 auVar82 [32];
  undefined1 auVar84 [32];
  undefined1 auVar86 [32];
  float fVar88;
  undefined4 uVar89;
  float fVar97;
  float fVar98;
  vint4 bi_2;
  undefined1 auVar90 [16];
  float fVar99;
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  vint4 bi_1;
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [32];
  vint4 ai_2;
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  vint4 bi;
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [32];
  vint4 ai;
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [32];
  vint4 ai_1;
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined1 auVar150 [32];
  float fVar158;
  vfloat4 a0_3;
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  __m128 a_1;
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  __m128 a;
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  float fVar179;
  float fVar185;
  float fVar186;
  float fVar187;
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  undefined1 auVar183 [16];
  undefined1 auVar184 [32];
  float fVar188;
  float fVar199;
  float fVar200;
  vfloat4 a0_1;
  undefined1 auVar189 [16];
  undefined1 auVar190 [16];
  float fVar201;
  undefined1 auVar191 [16];
  undefined1 auVar192 [16];
  undefined1 auVar193 [16];
  undefined1 auVar194 [16];
  undefined1 auVar195 [16];
  undefined1 auVar196 [16];
  undefined1 auVar197 [16];
  undefined1 auVar198 [16];
  float fVar202;
  float fVar203;
  float fVar204;
  float fVar205;
  float fVar213;
  float fVar214;
  vfloat4 a0;
  undefined1 auVar206 [16];
  float fVar215;
  undefined1 auVar207 [16];
  undefined1 auVar208 [16];
  undefined1 auVar209 [16];
  undefined1 auVar210 [16];
  undefined1 auVar211 [16];
  undefined1 auVar212 [16];
  undefined1 auVar216 [16];
  undefined1 auVar217 [16];
  undefined1 auVar218 [16];
  undefined1 auVar219 [16];
  undefined1 auVar220 [16];
  undefined1 auVar221 [16];
  undefined1 auVar222 [16];
  undefined1 auVar223 [16];
  undefined1 auVar225 [16];
  undefined1 auVar226 [16];
  undefined1 auVar227 [16];
  undefined1 auVar228 [16];
  undefined1 auVar229 [16];
  undefined1 auVar230 [16];
  undefined1 in_ZMM17 [64];
  undefined1 auVar231 [64];
  undefined1 auVar232 [64];
  undefined1 auVar233 [64];
  undefined1 auVar234 [64];
  undefined1 auVar235 [64];
  undefined1 auVar236 [64];
  undefined1 auVar237 [64];
  undefined1 auVar238 [64];
  undefined1 auVar239 [64];
  vfloat_impl<4> p02;
  vfloat_impl<4> p01;
  vfloat_impl<4> p00;
  RTCFilterFunctionNArguments args;
  uint mask_stack [4];
  vfloat_impl<4> p03;
  BBox1f cu_stack [4];
  BBox1f cv_stack [4];
  int local_330;
  float local_32c;
  long local_328;
  RayQueryContext *local_320;
  undefined1 local_318 [8];
  float fStack_310;
  float fStack_30c;
  undefined1 local_308 [8];
  float fStack_300;
  float fStack_2fc;
  undefined1 local_2f8 [8];
  float fStack_2f0;
  float fStack_2ec;
  undefined1 local_2e8 [8];
  float fStack_2e0;
  float fStack_2dc;
  undefined1 local_2d8 [16];
  undefined1 local_2c8 [16];
  undefined1 local_2b8 [16];
  undefined1 local_2a8 [16];
  undefined1 local_298 [16];
  undefined1 local_288 [16];
  undefined1 local_278 [16];
  Primitive *local_260;
  Precalculations *local_258;
  ulong local_250;
  RTCFilterFunctionNArguments local_248;
  undefined1 local_218 [8];
  float fStack_210;
  float fStack_20c;
  undefined1 local_208 [8];
  float fStack_200;
  float fStack_1fc;
  undefined1 local_1f8 [16];
  undefined1 local_1e8 [16];
  undefined1 local_1d8 [8];
  float fStack_1d0;
  float fStack_1cc;
  undefined1 local_1c8 [16];
  undefined1 local_1b8 [8];
  float fStack_1b0;
  float fStack_1ac;
  undefined1 local_1a8 [16];
  uint auStack_198 [4];
  undefined8 local_188;
  undefined4 local_180;
  undefined8 local_17c;
  undefined4 local_174;
  uint local_170;
  uint local_16c;
  uint local_168;
  undefined1 local_158 [8];
  float fStack_150;
  float fStack_14c;
  undefined1 local_148 [16];
  undefined1 local_138 [16];
  undefined1 local_128 [16];
  undefined1 local_118 [16];
  undefined1 local_108 [16];
  undefined1 local_f8 [8];
  float fStack_f0;
  float fStack_ec;
  undefined1 local_e8 [16];
  undefined1 local_d8 [16];
  undefined1 local_c8 [16];
  undefined1 local_b8 [32];
  undefined8 uStack_98;
  undefined4 local_78;
  undefined4 uStack_74;
  undefined4 uStack_70;
  undefined4 uStack_6c;
  undefined4 uStack_68;
  undefined4 uStack_64;
  undefined4 uStack_60;
  undefined4 uStack_5c;
  ulong auStack_58 [5];
  ulong uVar24;
  undefined1 auVar77 [32];
  undefined1 auVar79 [32];
  undefined1 auVar81 [32];
  undefined1 auVar83 [32];
  undefined1 auVar85 [32];
  undefined1 auVar87 [32];
  undefined1 auVar224 [32];
  
  uVar23 = (ulong)(byte)prim[1];
  fVar204 = *(float *)(prim + uVar23 * 0x19 + 0x12);
  auVar35 = vsubps_avx((undefined1  [16])(ray->org).field_0,
                       *(undefined1 (*) [16])(prim + uVar23 * 0x19 + 6));
  auVar51._0_4_ = fVar204 * auVar35._0_4_;
  auVar51._4_4_ = fVar204 * auVar35._4_4_;
  auVar51._8_4_ = fVar204 * auVar35._8_4_;
  auVar51._12_4_ = fVar204 * auVar35._12_4_;
  auVar50._0_4_ = fVar204 * (ray->dir).field_0.m128[0];
  auVar50._4_4_ = fVar204 * (ray->dir).field_0.m128[1];
  auVar50._8_4_ = fVar204 * (ray->dir).field_0.m128[2];
  auVar50._12_4_ = fVar204 * (ray->dir).field_0.m128[3];
  auVar35 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar23 * 4 + 6)));
  auVar35 = vcvtdq2ps_avx(auVar35);
  auVar36 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar23 * 5 + 6)));
  auVar37 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar23 * 6 + 6)));
  auVar36 = vcvtdq2ps_avx(auVar36);
  auVar37 = vcvtdq2ps_avx(auVar37);
  auVar38 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar23 * 0xb + 6)));
  auVar38 = vcvtdq2ps_avx(auVar38);
  auVar44 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar23 * 0xc + 6)));
  auVar40 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar23 * 0xd + 6)));
  auVar44 = vcvtdq2ps_avx(auVar44);
  auVar40 = vcvtdq2ps_avx(auVar40);
  auVar39 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar23 * 0x12 + 6)));
  auVar39 = vcvtdq2ps_avx(auVar39);
  auVar41 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar23 * 0x13 + 6)));
  auVar42 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar23 * 0x14 + 6)));
  auVar41 = vcvtdq2ps_avx(auVar41);
  auVar42 = vcvtdq2ps_avx(auVar42);
  auVar216._4_4_ = auVar50._0_4_;
  auVar216._0_4_ = auVar50._0_4_;
  auVar216._8_4_ = auVar50._0_4_;
  auVar216._12_4_ = auVar50._0_4_;
  auVar43 = vshufps_avx(auVar50,auVar50,0x55);
  auVar45 = vshufps_avx(auVar50,auVar50,0xaa);
  fVar204 = auVar45._0_4_;
  auVar120._0_4_ = fVar204 * auVar37._0_4_;
  fVar188 = auVar45._4_4_;
  auVar120._4_4_ = fVar188 * auVar37._4_4_;
  fVar199 = auVar45._8_4_;
  auVar120._8_4_ = fVar199 * auVar37._8_4_;
  fVar200 = auVar45._12_4_;
  auVar120._12_4_ = fVar200 * auVar37._12_4_;
  auVar48._0_4_ = auVar40._0_4_ * fVar204;
  auVar48._4_4_ = auVar40._4_4_ * fVar188;
  auVar48._8_4_ = auVar40._8_4_ * fVar199;
  auVar48._12_4_ = auVar40._12_4_ * fVar200;
  auVar90._0_4_ = auVar42._0_4_ * fVar204;
  auVar90._4_4_ = auVar42._4_4_ * fVar188;
  auVar90._8_4_ = auVar42._8_4_ * fVar199;
  auVar90._12_4_ = auVar42._12_4_ * fVar200;
  auVar45 = vfmadd231ps_fma(auVar120,auVar43,auVar36);
  auVar46 = vfmadd231ps_fma(auVar48,auVar43,auVar44);
  auVar43 = vfmadd231ps_fma(auVar90,auVar41,auVar43);
  auVar47 = vfmadd231ps_fma(auVar45,auVar216,auVar35);
  auVar46 = vfmadd231ps_fma(auVar46,auVar216,auVar38);
  auVar50 = vfmadd231ps_fma(auVar43,auVar39,auVar216);
  auVar217._4_4_ = auVar51._0_4_;
  auVar217._0_4_ = auVar51._0_4_;
  auVar217._8_4_ = auVar51._0_4_;
  auVar217._12_4_ = auVar51._0_4_;
  auVar43 = vshufps_avx(auVar51,auVar51,0x55);
  auVar45 = vshufps_avx(auVar51,auVar51,0xaa);
  fVar204 = auVar45._0_4_;
  auVar225._0_4_ = fVar204 * auVar37._0_4_;
  fVar188 = auVar45._4_4_;
  auVar225._4_4_ = fVar188 * auVar37._4_4_;
  fVar199 = auVar45._8_4_;
  auVar225._8_4_ = fVar199 * auVar37._8_4_;
  fVar200 = auVar45._12_4_;
  auVar225._12_4_ = fVar200 * auVar37._12_4_;
  auVar53._0_4_ = auVar40._0_4_ * fVar204;
  auVar53._4_4_ = auVar40._4_4_ * fVar188;
  auVar53._8_4_ = auVar40._8_4_ * fVar199;
  auVar53._12_4_ = auVar40._12_4_ * fVar200;
  auVar52._0_4_ = auVar42._0_4_ * fVar204;
  auVar52._4_4_ = auVar42._4_4_ * fVar188;
  auVar52._8_4_ = auVar42._8_4_ * fVar199;
  auVar52._12_4_ = auVar42._12_4_ * fVar200;
  auVar36 = vfmadd231ps_fma(auVar225,auVar43,auVar36);
  auVar37 = vfmadd231ps_fma(auVar53,auVar43,auVar44);
  auVar44 = vfmadd231ps_fma(auVar52,auVar43,auVar41);
  auVar41 = vfmadd231ps_fma(auVar36,auVar217,auVar35);
  auVar42 = vfmadd231ps_fma(auVar37,auVar217,auVar38);
  auVar43 = vfmadd231ps_fma(auVar44,auVar217,auVar39);
  auVar72._16_16_ = in_YmmResult._16_16_;
  auVar35 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
  auVar235 = ZEXT1664(auVar35);
  auVar128._8_4_ = 0x219392ef;
  auVar128._0_8_ = 0x219392ef219392ef;
  auVar128._12_4_ = 0x219392ef;
  auVar36 = vandps_avx512vl(auVar47,auVar35);
  uVar28 = vcmpps_avx512vl(auVar36,auVar128,1);
  bVar29 = (bool)((byte)uVar28 & 1);
  auVar45._0_4_ = (uint)bVar29 * 0x219392ef | (uint)!bVar29 * auVar47._0_4_;
  bVar29 = (bool)((byte)(uVar28 >> 1) & 1);
  auVar45._4_4_ = (uint)bVar29 * 0x219392ef | (uint)!bVar29 * auVar47._4_4_;
  bVar29 = (bool)((byte)(uVar28 >> 2) & 1);
  auVar45._8_4_ = (uint)bVar29 * 0x219392ef | (uint)!bVar29 * auVar47._8_4_;
  bVar29 = (bool)((byte)(uVar28 >> 3) & 1);
  auVar45._12_4_ = (uint)bVar29 * 0x219392ef | (uint)!bVar29 * auVar47._12_4_;
  auVar36 = vandps_avx512vl(auVar46,auVar35);
  uVar28 = vcmpps_avx512vl(auVar36,auVar128,1);
  bVar29 = (bool)((byte)uVar28 & 1);
  auVar47._0_4_ = (uint)bVar29 * 0x219392ef | (uint)!bVar29 * auVar46._0_4_;
  bVar29 = (bool)((byte)(uVar28 >> 1) & 1);
  auVar47._4_4_ = (uint)bVar29 * 0x219392ef | (uint)!bVar29 * auVar46._4_4_;
  bVar29 = (bool)((byte)(uVar28 >> 2) & 1);
  auVar47._8_4_ = (uint)bVar29 * 0x219392ef | (uint)!bVar29 * auVar46._8_4_;
  bVar29 = (bool)((byte)(uVar28 >> 3) & 1);
  auVar47._12_4_ = (uint)bVar29 * 0x219392ef | (uint)!bVar29 * auVar46._12_4_;
  auVar35 = vandps_avx512vl(auVar50,auVar35);
  uVar28 = vcmpps_avx512vl(auVar35,auVar128,1);
  bVar29 = (bool)((byte)uVar28 & 1);
  auVar46._0_4_ = (uint)bVar29 * 0x219392ef | (uint)!bVar29 * auVar50._0_4_;
  bVar29 = (bool)((byte)(uVar28 >> 1) & 1);
  auVar46._4_4_ = (uint)bVar29 * 0x219392ef | (uint)!bVar29 * auVar50._4_4_;
  bVar29 = (bool)((byte)(uVar28 >> 2) & 1);
  auVar46._8_4_ = (uint)bVar29 * 0x219392ef | (uint)!bVar29 * auVar50._8_4_;
  bVar29 = (bool)((byte)(uVar28 >> 3) & 1);
  auVar46._12_4_ = (uint)bVar29 * 0x219392ef | (uint)!bVar29 * auVar50._12_4_;
  auVar35 = vrcp14ps_avx512vl(auVar45);
  auVar36 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
  auVar236 = ZEXT1664(auVar36);
  auVar37 = vfnmadd213ps_avx512vl(auVar45,auVar35,auVar36);
  auVar37 = vfmadd132ps_fma(auVar37,auVar35,auVar35);
  auVar35 = vrcp14ps_avx512vl(auVar47);
  auVar38 = vfnmadd213ps_avx512vl(auVar47,auVar35,auVar36);
  auVar40 = vfmadd132ps_fma(auVar38,auVar35,auVar35);
  auVar35 = vrcp14ps_avx512vl(auVar46);
  auVar36 = vfnmadd213ps_avx512vl(auVar46,auVar35,auVar36);
  auVar39 = vfmadd132ps_fma(auVar36,auVar35,auVar35);
  auVar35._8_8_ = 0;
  auVar35._0_8_ = *(ulong *)(prim + uVar23 * 7 + 6);
  auVar35 = vpmovsxwd_avx(auVar35);
  auVar35 = vcvtdq2ps_avx(auVar35);
  auVar35 = vsubps_avx(auVar35,auVar41);
  auVar129._0_4_ = auVar37._0_4_ * auVar35._0_4_;
  auVar129._4_4_ = auVar37._4_4_ * auVar35._4_4_;
  auVar129._8_4_ = auVar37._8_4_ * auVar35._8_4_;
  auVar129._12_4_ = auVar37._12_4_ * auVar35._12_4_;
  auVar36._8_8_ = 0;
  auVar36._0_8_ = *(ulong *)(prim + uVar23 * 9 + 6);
  auVar35 = vpmovsxwd_avx(auVar36);
  auVar35 = vcvtdq2ps_avx(auVar35);
  auVar35 = vsubps_avx(auVar35,auVar41);
  auVar121._0_4_ = auVar37._0_4_ * auVar35._0_4_;
  auVar121._4_4_ = auVar37._4_4_ * auVar35._4_4_;
  auVar121._8_4_ = auVar37._8_4_ * auVar35._8_4_;
  auVar121._12_4_ = auVar37._12_4_ * auVar35._12_4_;
  auVar37._8_8_ = 0;
  auVar37._0_8_ = *(ulong *)(prim + uVar23 * 0xe + 6);
  auVar35 = vpmovsxwd_avx(auVar37);
  auVar35 = vcvtdq2ps_avx(auVar35);
  auVar35 = vsubps_avx(auVar35,auVar42);
  auVar140._0_4_ = auVar40._0_4_ * auVar35._0_4_;
  auVar140._4_4_ = auVar40._4_4_ * auVar35._4_4_;
  auVar140._8_4_ = auVar40._8_4_ * auVar35._8_4_;
  auVar140._12_4_ = auVar40._12_4_ * auVar35._12_4_;
  auVar37 = vpbroadcastd_avx512vl();
  auVar38._8_8_ = 0;
  auVar38._0_8_ = *(ulong *)(prim + (ulong)(byte)prim[1] * 0x10 + 6);
  auVar35 = vpmovsxwd_avx(auVar38);
  auVar35 = vcvtdq2ps_avx(auVar35);
  auVar36 = vsubps_avx(auVar35,auVar42);
  auVar44._8_8_ = 0;
  auVar44._0_8_ = *(ulong *)(prim + uVar23 * 0x15 + 6);
  auVar35 = vpmovsxwd_avx(auVar44);
  auVar49._0_4_ = auVar40._0_4_ * auVar36._0_4_;
  auVar49._4_4_ = auVar40._4_4_ * auVar36._4_4_;
  auVar49._8_4_ = auVar40._8_4_ * auVar36._8_4_;
  auVar49._12_4_ = auVar40._12_4_ * auVar36._12_4_;
  auVar35 = vcvtdq2ps_avx(auVar35);
  auVar35 = vsubps_avx(auVar35,auVar43);
  auVar115._0_4_ = auVar39._0_4_ * auVar35._0_4_;
  auVar115._4_4_ = auVar39._4_4_ * auVar35._4_4_;
  auVar115._8_4_ = auVar39._8_4_ * auVar35._8_4_;
  auVar115._12_4_ = auVar39._12_4_ * auVar35._12_4_;
  auVar40._8_8_ = 0;
  auVar40._0_8_ = *(ulong *)(prim + uVar23 * 0x17 + 6);
  auVar35 = vpmovsxwd_avx(auVar40);
  auVar35 = vcvtdq2ps_avx(auVar35);
  auVar35 = vsubps_avx(auVar35,auVar43);
  auVar54._0_4_ = auVar39._0_4_ * auVar35._0_4_;
  auVar54._4_4_ = auVar39._4_4_ * auVar35._4_4_;
  auVar54._8_4_ = auVar39._8_4_ * auVar35._8_4_;
  auVar54._12_4_ = auVar39._12_4_ * auVar35._12_4_;
  auVar35 = vpminsd_avx(auVar129,auVar121);
  auVar36 = vpminsd_avx(auVar140,auVar49);
  auVar35 = vmaxps_avx(auVar35,auVar36);
  auVar36 = vpminsd_avx(auVar115,auVar54);
  uVar89 = *(undefined4 *)((long)&(ray->org).field_0 + 0xc);
  auVar39._4_4_ = uVar89;
  auVar39._0_4_ = uVar89;
  auVar39._8_4_ = uVar89;
  auVar39._12_4_ = uVar89;
  auVar36 = vmaxps_avx512vl(auVar36,auVar39);
  auVar35 = vmaxps_avx(auVar35,auVar36);
  auVar41._8_4_ = 0x3f7ffffa;
  auVar41._0_8_ = 0x3f7ffffa3f7ffffa;
  auVar41._12_4_ = 0x3f7ffffa;
  local_118 = vmulps_avx512vl(auVar35,auVar41);
  auVar35 = vpmaxsd_avx(auVar129,auVar121);
  auVar36 = vpmaxsd_avx(auVar140,auVar49);
  auVar35 = vminps_avx(auVar35,auVar36);
  auVar36 = vpmaxsd_avx(auVar115,auVar54);
  fVar204 = ray->tfar;
  auVar42._4_4_ = fVar204;
  auVar42._0_4_ = fVar204;
  auVar42._8_4_ = fVar204;
  auVar42._12_4_ = fVar204;
  auVar36 = vminps_avx512vl(auVar36,auVar42);
  auVar35 = vminps_avx(auVar35,auVar36);
  auVar43._8_4_ = 0x3f800003;
  auVar43._0_8_ = 0x3f8000033f800003;
  auVar43._12_4_ = 0x3f800003;
  auVar35 = vmulps_avx512vl(auVar35,auVar43);
  uVar11 = vcmpps_avx512vl(local_118,auVar35,2);
  uVar12 = vpcmpgtd_avx512vl(auVar37,_DAT_01f4ad30);
  uVar28 = CONCAT44((int)((ulong)unaff_RBP >> 0x20),(uint)((byte)uVar11 & 0xf & (byte)uVar12));
  auVar72._0_16_ = vbroadcastss_avx512vl(ZEXT416(0x40400000));
  auVar239 = ZEXT1664(auVar72._0_16_);
  auVar237 = ZEXT464(0x3f800000);
  local_258 = pre;
LAB_017d9c2c:
  if (uVar28 == 0) {
LAB_017db670:
    return uVar28 != 0;
  }
  lVar25 = 0;
  for (uVar23 = uVar28; (uVar23 & 1) == 0; uVar23 = uVar23 >> 1 | 0x8000000000000000) {
    lVar25 = lVar25 + 1;
  }
  uVar5 = *(uint *)(prim + 2);
  local_250 = (ulong)*(uint *)(prim + lVar25 * 4 + 6);
  pGVar7 = (context->scene->geometries).items[uVar5].ptr;
  lVar8 = *(long *)&pGVar7[1].time_range.upper;
  uVar23 = (ulong)*(uint *)(*(long *)&pGVar7->field_0x58 +
                           local_250 *
                           pGVar7[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>.
                           _M_i);
  auVar35 = *(undefined1 (*) [16])(lVar8 + (long)pGVar7[1].intersectionFilterN * uVar23);
  lVar25 = uVar23 + 1;
  auVar36 = *(undefined1 (*) [16])(lVar8 + (long)pGVar7[1].intersectionFilterN * lVar25);
  _Var9 = pGVar7[2].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
  auVar37 = *(undefined1 (*) [16])(_Var9 + (long)pGVar7[2].userPtr * uVar23);
  auVar38 = *(undefined1 (*) [16])(_Var9 + (long)pGVar7[2].userPtr * lVar25);
  auVar55._16_16_ = auVar72._16_16_;
  auVar39 = vbroadcastss_avx512vl(ZEXT416(0x3eaaaaab));
  auVar40 = vfmadd132ps_avx512vl
                      (*(undefined1 (*) [16])
                        (pGVar7[2].intersectionFilterN + (long)pGVar7[2].pointQueryFunc * uVar23),
                       auVar35,auVar39);
  auVar41 = vfnmadd132ps_avx512vl
                      (*(undefined1 (*) [16])
                        (pGVar7[2].intersectionFilterN + (long)pGVar7[2].pointQueryFunc * lVar25),
                       auVar36,auVar39);
  auVar42 = vfmadd132ps_avx512vl
                      (*(undefined1 (*) [16])
                        ((long)pGVar7[3].userPtr + uVar23 * *(long *)&pGVar7[3].fnumTimeSegments),
                       auVar37,auVar39);
  auVar43 = vfnmadd132ps_avx512vl
                      (*(undefined1 (*) [16])
                        ((long)pGVar7[3].userPtr + *(long *)&pGVar7[3].fnumTimeSegments * lVar25),
                       auVar38,auVar39);
  auVar55._0_16_ = vxorps_avx512vl(in_ZMM17._0_16_,in_ZMM17._0_16_);
  auVar44 = vmulps_avx512vl(auVar36,auVar55._0_16_);
  auVar45 = vfmadd231ps_avx512vl(auVar44,auVar41,auVar55._0_16_);
  auVar44 = vfmadd213ps_fma(ZEXT816(0) << 0x40,auVar40,auVar45);
  auVar100._0_4_ = auVar35._0_4_ + auVar44._0_4_;
  auVar100._4_4_ = auVar35._4_4_ + auVar44._4_4_;
  auVar100._8_4_ = auVar35._8_4_ + auVar44._8_4_;
  auVar100._12_4_ = auVar35._12_4_ + auVar44._12_4_;
  auVar50 = auVar239._0_16_;
  auVar44 = vfmadd231ps_avx512vl(auVar45,auVar40,auVar50);
  auVar45 = vfnmadd231ps_avx512vl(auVar44,auVar35,auVar50);
  auVar44 = vmulps_avx512vl(auVar38,auVar55._0_16_);
  auVar46 = vfmadd231ps_avx512vl(auVar44,auVar43,auVar55._0_16_);
  auVar44 = vfmadd213ps_fma(ZEXT816(0) << 0x40,auVar42,auVar46);
  auVar206._0_4_ = auVar37._0_4_ + auVar44._0_4_;
  auVar206._4_4_ = auVar37._4_4_ + auVar44._4_4_;
  auVar206._8_4_ = auVar37._8_4_ + auVar44._8_4_;
  auVar206._12_4_ = auVar37._12_4_ + auVar44._12_4_;
  auVar44 = vfmadd231ps_avx512vl(auVar46,auVar42,auVar50);
  auVar46 = vfnmadd231ps_avx512vl(auVar44,auVar37,auVar50);
  auVar44 = vfmadd213ps_fma(ZEXT816(0) << 0x20,auVar41,auVar36);
  auVar44 = vfmadd231ps_avx512vl(auVar44,auVar40,auVar55._0_16_);
  auVar47 = vfmadd231ps_avx512vl(auVar44,auVar35,auVar55._0_16_);
  auVar36 = vmulps_avx512vl(auVar36,auVar50);
  auVar36 = vfnmadd231ps_avx512vl(auVar36,auVar50,auVar41);
  auVar36 = vfmadd231ps_avx512vl(auVar36,auVar55._0_16_,auVar40);
  auVar41 = vfnmadd231ps_avx512vl(auVar36,auVar55._0_16_,auVar35);
  auVar35 = vfmadd213ps_fma(ZEXT816(0) << 0x20,auVar43,auVar38);
  auVar35 = vfmadd231ps_avx512vl(auVar35,auVar42,auVar55._0_16_);
  auVar44 = vfmadd231ps_avx512vl(auVar35,auVar37,auVar55._0_16_);
  auVar35 = vmulps_avx512vl(auVar38,auVar50);
  auVar35 = vfnmadd231ps_avx512vl(auVar35,auVar50,auVar43);
  auVar35 = vfmadd231ps_avx512vl(auVar35,auVar55._0_16_,auVar42);
  auVar40 = vfnmadd231ps_avx512vl(auVar35,auVar55._0_16_,auVar37);
  auVar35 = vshufps_avx(auVar45,auVar45,0xc9);
  auVar36 = vshufps_avx(auVar206,auVar206,0xc9);
  fVar88 = auVar45._0_4_;
  auVar141._0_4_ = fVar88 * auVar36._0_4_;
  fVar97 = auVar45._4_4_;
  auVar141._4_4_ = fVar97 * auVar36._4_4_;
  fVar98 = auVar45._8_4_;
  auVar141._8_4_ = fVar98 * auVar36._8_4_;
  fVar99 = auVar45._12_4_;
  auVar141._12_4_ = fVar99 * auVar36._12_4_;
  auVar36 = vfmsub231ps_fma(auVar141,auVar35,auVar206);
  auVar37 = vshufps_avx(auVar36,auVar36,0xc9);
  auVar36 = vshufps_avx(auVar46,auVar46,0xc9);
  auVar159._0_4_ = auVar36._0_4_ * fVar88;
  auVar159._4_4_ = auVar36._4_4_ * fVar97;
  auVar159._8_4_ = auVar36._8_4_ * fVar98;
  auVar159._12_4_ = auVar36._12_4_ * fVar99;
  auVar35 = vfmsub231ps_fma(auVar159,auVar35,auVar46);
  auVar38 = vshufps_avx(auVar35,auVar35,0xc9);
  auVar35 = vshufps_avx(auVar41,auVar41,0xc9);
  auVar36 = vshufps_avx(auVar44,auVar44,0xc9);
  fVar204 = auVar41._0_4_;
  auVar167._0_4_ = auVar36._0_4_ * fVar204;
  fVar188 = auVar41._4_4_;
  auVar167._4_4_ = auVar36._4_4_ * fVar188;
  fVar199 = auVar41._8_4_;
  auVar167._8_4_ = auVar36._8_4_ * fVar199;
  fVar200 = auVar41._12_4_;
  auVar167._12_4_ = auVar36._12_4_ * fVar200;
  auVar36 = vfmsub231ps_fma(auVar167,auVar35,auVar44);
  auVar44 = vshufps_avx(auVar36,auVar36,0xc9);
  auVar36 = vshufps_avx(auVar40,auVar40,0xc9);
  auVar168._0_4_ = auVar36._0_4_ * fVar204;
  auVar168._4_4_ = auVar36._4_4_ * fVar188;
  auVar168._8_4_ = auVar36._8_4_ * fVar199;
  auVar168._12_4_ = auVar36._12_4_ * fVar200;
  auVar35 = vfmsub231ps_fma(auVar168,auVar35,auVar40);
  auVar40 = vshufps_avx(auVar35,auVar35,0xc9);
  auVar35 = vdpps_avx(auVar37,auVar37,0x7f);
  fVar201 = auVar35._0_4_;
  auVar70._4_28_ = auVar55._4_28_;
  auVar70._0_4_ = fVar201;
  auVar36 = vrsqrt14ss_avx512f(auVar55._0_16_,auVar70._0_16_);
  fVar202 = auVar36._0_4_;
  fVar203 = fVar202 * 1.5 - fVar201 * 0.5 * fVar202 * fVar202 * fVar202;
  auVar36 = vdpps_avx(auVar37,auVar38,0x7f);
  fVar205 = fVar203 * auVar37._0_4_;
  fVar213 = fVar203 * auVar37._4_4_;
  fVar214 = fVar203 * auVar37._8_4_;
  fVar215 = fVar203 * auVar37._12_4_;
  auVar160._0_4_ = fVar201 * auVar38._0_4_;
  auVar160._4_4_ = fVar201 * auVar38._4_4_;
  auVar160._8_4_ = fVar201 * auVar38._8_4_;
  auVar160._12_4_ = fVar201 * auVar38._12_4_;
  fVar201 = auVar36._0_4_;
  auVar142._0_4_ = fVar201 * auVar37._0_4_;
  auVar142._4_4_ = fVar201 * auVar37._4_4_;
  auVar142._8_4_ = fVar201 * auVar37._8_4_;
  auVar142._12_4_ = fVar201 * auVar37._12_4_;
  auVar37 = vsubps_avx(auVar160,auVar142);
  auVar36 = vrcp14ss_avx512f(auVar55._0_16_,auVar70._0_16_);
  auVar35 = vfnmadd213ss_avx512f(auVar35,auVar36,ZEXT416(0x40000000));
  fVar201 = auVar36._0_4_ * auVar35._0_4_;
  auVar35 = vdpps_avx(auVar44,auVar44,0x7f);
  fVar202 = auVar35._0_4_;
  auVar71._16_16_ = auVar55._16_16_;
  auVar71._0_16_ = auVar55._0_16_;
  auVar56._4_28_ = auVar71._4_28_;
  auVar56._0_4_ = fVar202;
  auVar36 = vrsqrt14ss_avx512f(auVar55._0_16_,auVar56._0_16_);
  fVar158 = auVar36._0_4_;
  fVar158 = fVar158 * 1.5 - fVar202 * 0.5 * fVar158 * fVar158 * fVar158;
  fVar179 = fVar158 * auVar44._0_4_;
  fVar185 = fVar158 * auVar44._4_4_;
  fVar186 = fVar158 * auVar44._8_4_;
  fVar187 = fVar158 * auVar44._12_4_;
  auVar36 = vdpps_avx(auVar44,auVar40,0x7f);
  auVar130._0_4_ = fVar202 * auVar40._0_4_;
  auVar130._4_4_ = fVar202 * auVar40._4_4_;
  auVar130._8_4_ = fVar202 * auVar40._8_4_;
  auVar130._12_4_ = fVar202 * auVar40._12_4_;
  fVar202 = auVar36._0_4_;
  auVar122._0_4_ = fVar202 * auVar44._0_4_;
  auVar122._4_4_ = fVar202 * auVar44._4_4_;
  auVar122._8_4_ = fVar202 * auVar44._8_4_;
  auVar122._12_4_ = fVar202 * auVar44._12_4_;
  auVar38 = vsubps_avx(auVar130,auVar122);
  auVar36 = vrcp14ss_avx512f(auVar55._0_16_,auVar56._0_16_);
  auVar35 = vfnmadd213ss_avx512f(auVar35,auVar36,ZEXT416(0x40000000));
  fVar202 = auVar36._0_4_ * auVar35._0_4_;
  auVar35 = vshufps_avx(auVar100,auVar100,0xff);
  auVar151._0_4_ = fVar205 * auVar35._0_4_;
  auVar151._4_4_ = fVar213 * auVar35._4_4_;
  auVar151._8_4_ = fVar214 * auVar35._8_4_;
  auVar151._12_4_ = fVar215 * auVar35._12_4_;
  local_1a8 = vsubps_avx(auVar100,auVar151);
  auVar36 = vshufps_avx(auVar45,auVar45,0xff);
  auVar131._0_4_ = auVar36._0_4_ * fVar205 + auVar35._0_4_ * fVar203 * fVar201 * auVar37._0_4_;
  auVar131._4_4_ = auVar36._4_4_ * fVar213 + auVar35._4_4_ * fVar203 * fVar201 * auVar37._4_4_;
  auVar131._8_4_ = auVar36._8_4_ * fVar214 + auVar35._8_4_ * fVar203 * fVar201 * auVar37._8_4_;
  auVar131._12_4_ = auVar36._12_4_ * fVar215 + auVar35._12_4_ * fVar203 * fVar201 * auVar37._12_4_;
  auVar37 = vsubps_avx(auVar45,auVar131);
  local_1b8._0_4_ = auVar100._0_4_ + auVar151._0_4_;
  local_1b8._4_4_ = auVar100._4_4_ + auVar151._4_4_;
  fStack_1b0 = auVar100._8_4_ + auVar151._8_4_;
  fStack_1ac = auVar100._12_4_ + auVar151._12_4_;
  auVar91._0_4_ = fVar88 + auVar131._0_4_;
  auVar91._4_4_ = fVar97 + auVar131._4_4_;
  auVar91._8_4_ = fVar98 + auVar131._8_4_;
  auVar91._12_4_ = fVar99 + auVar131._12_4_;
  auVar35 = vshufps_avx(auVar47,auVar47,0xff);
  auVar132._0_4_ = fVar179 * auVar35._0_4_;
  auVar132._4_4_ = fVar185 * auVar35._4_4_;
  auVar132._8_4_ = fVar186 * auVar35._8_4_;
  auVar132._12_4_ = fVar187 * auVar35._12_4_;
  local_1c8 = vsubps_avx(auVar47,auVar132);
  auVar36 = vshufps_avx(auVar41,auVar41,0xff);
  auVar101._0_4_ = fVar179 * auVar36._0_4_ + auVar35._0_4_ * fVar158 * auVar38._0_4_ * fVar202;
  auVar101._4_4_ = fVar185 * auVar36._4_4_ + auVar35._4_4_ * fVar158 * auVar38._4_4_ * fVar202;
  auVar101._8_4_ = fVar186 * auVar36._8_4_ + auVar35._8_4_ * fVar158 * auVar38._8_4_ * fVar202;
  auVar101._12_4_ = fVar187 * auVar36._12_4_ + auVar35._12_4_ * fVar158 * auVar38._12_4_ * fVar202;
  auVar35 = vsubps_avx(auVar41,auVar101);
  _local_1d8 = vaddps_avx512vl(auVar47,auVar132);
  auVar102._0_4_ = fVar204 + auVar101._0_4_;
  auVar102._4_4_ = fVar188 + auVar101._4_4_;
  auVar102._8_4_ = fVar199 + auVar101._8_4_;
  auVar102._12_4_ = fVar200 + auVar101._12_4_;
  auVar36 = vmulps_avx512vl(auVar37,auVar39);
  local_1e8 = vaddps_avx512vl(local_1a8,auVar36);
  auVar35 = vmulps_avx512vl(auVar35,auVar39);
  local_1f8 = vsubps_avx512vl(local_1c8,auVar35);
  auVar35 = vmulps_avx512vl(auVar91,auVar39);
  _local_208 = vaddps_avx512vl(_local_1b8,auVar35);
  auVar35 = vmulps_avx512vl(auVar102,auVar39);
  _local_218 = vsubps_avx512vl(_local_1d8,auVar35);
  aVar2 = (ray->org).field_0;
  auVar36 = vsubps_avx(local_1a8,(undefined1  [16])aVar2);
  uVar89 = auVar36._0_4_;
  auVar103._4_4_ = uVar89;
  auVar103._0_4_ = uVar89;
  auVar103._8_4_ = uVar89;
  auVar103._12_4_ = uVar89;
  auVar35 = vshufps_avx(auVar36,auVar36,0x55);
  aVar3 = (pre->ray_space).vx.field_0;
  aVar4 = (pre->ray_space).vy.field_0;
  auVar36 = vshufps_avx(auVar36,auVar36,0xaa);
  fVar204 = (pre->ray_space).vz.field_0.m128[0];
  fVar188 = (pre->ray_space).vz.field_0.m128[1];
  fVar199 = (pre->ray_space).vz.field_0.m128[2];
  fVar200 = (pre->ray_space).vz.field_0.m128[3];
  auVar92._0_4_ = fVar204 * auVar36._0_4_;
  auVar92._4_4_ = fVar188 * auVar36._4_4_;
  auVar92._8_4_ = fVar199 * auVar36._8_4_;
  auVar92._12_4_ = fVar200 * auVar36._12_4_;
  auVar35 = vfmadd231ps_fma(auVar92,(undefined1  [16])aVar4,auVar35);
  auVar44 = vfmadd231ps_fma(auVar35,(undefined1  [16])aVar3,auVar103);
  auVar36 = vsubps_avx512vl(local_1e8,(undefined1  [16])aVar2);
  uVar89 = auVar36._0_4_;
  auVar107._4_4_ = uVar89;
  auVar107._0_4_ = uVar89;
  auVar107._8_4_ = uVar89;
  auVar107._12_4_ = uVar89;
  auVar35 = vshufps_avx(auVar36,auVar36,0x55);
  auVar36 = vshufps_avx(auVar36,auVar36,0xaa);
  auVar104._0_4_ = fVar204 * auVar36._0_4_;
  auVar104._4_4_ = fVar188 * auVar36._4_4_;
  auVar104._8_4_ = fVar199 * auVar36._8_4_;
  auVar104._12_4_ = fVar200 * auVar36._12_4_;
  auVar35 = vfmadd231ps_fma(auVar104,(undefined1  [16])aVar4,auVar35);
  auVar40 = vfmadd231ps_fma(auVar35,(undefined1  [16])aVar3,auVar107);
  auVar36 = vsubps_avx512vl(local_1f8,(undefined1  [16])aVar2);
  uVar89 = auVar36._0_4_;
  auVar143._4_4_ = uVar89;
  auVar143._0_4_ = uVar89;
  auVar143._8_4_ = uVar89;
  auVar143._12_4_ = uVar89;
  auVar35 = vshufps_avx(auVar36,auVar36,0x55);
  auVar36 = vshufps_avx(auVar36,auVar36,0xaa);
  auVar108._0_4_ = fVar204 * auVar36._0_4_;
  auVar108._4_4_ = fVar188 * auVar36._4_4_;
  auVar108._8_4_ = fVar199 * auVar36._8_4_;
  auVar108._12_4_ = fVar200 * auVar36._12_4_;
  auVar35 = vfmadd231ps_fma(auVar108,(undefined1  [16])aVar4,auVar35);
  auVar39 = vfmadd231ps_fma(auVar35,(undefined1  [16])aVar3,auVar143);
  auVar36 = vsubps_avx(local_1c8,(undefined1  [16])aVar2);
  uVar89 = auVar36._0_4_;
  auVar161._4_4_ = uVar89;
  auVar161._0_4_ = uVar89;
  auVar161._8_4_ = uVar89;
  auVar161._12_4_ = uVar89;
  auVar35 = vshufps_avx(auVar36,auVar36,0x55);
  auVar36 = vshufps_avx(auVar36,auVar36,0xaa);
  auVar144._0_4_ = fVar204 * auVar36._0_4_;
  auVar144._4_4_ = fVar188 * auVar36._4_4_;
  auVar144._8_4_ = fVar199 * auVar36._8_4_;
  auVar144._12_4_ = fVar200 * auVar36._12_4_;
  auVar35 = vfmadd231ps_fma(auVar144,(undefined1  [16])aVar4,auVar35);
  auVar41 = vfmadd231ps_fma(auVar35,(undefined1  [16])aVar3,auVar161);
  auVar36 = vsubps_avx(_local_1b8,(undefined1  [16])aVar2);
  uVar89 = auVar36._0_4_;
  auVar169._4_4_ = uVar89;
  auVar169._0_4_ = uVar89;
  auVar169._8_4_ = uVar89;
  auVar169._12_4_ = uVar89;
  auVar35 = vshufps_avx(auVar36,auVar36,0x55);
  auVar36 = vshufps_avx(auVar36,auVar36,0xaa);
  auVar162._0_4_ = auVar36._0_4_ * fVar204;
  auVar162._4_4_ = auVar36._4_4_ * fVar188;
  auVar162._8_4_ = auVar36._8_4_ * fVar199;
  auVar162._12_4_ = auVar36._12_4_ * fVar200;
  auVar35 = vfmadd231ps_fma(auVar162,(undefined1  [16])aVar4,auVar35);
  auVar42 = vfmadd231ps_fma(auVar35,(undefined1  [16])aVar3,auVar169);
  auVar36 = vsubps_avx512vl(_local_208,(undefined1  [16])aVar2);
  uVar89 = auVar36._0_4_;
  auVar180._4_4_ = uVar89;
  auVar180._0_4_ = uVar89;
  auVar180._8_4_ = uVar89;
  auVar180._12_4_ = uVar89;
  auVar35 = vshufps_avx(auVar36,auVar36,0x55);
  auVar36 = vshufps_avx(auVar36,auVar36,0xaa);
  auVar170._0_4_ = auVar36._0_4_ * fVar204;
  auVar170._4_4_ = auVar36._4_4_ * fVar188;
  auVar170._8_4_ = auVar36._8_4_ * fVar199;
  auVar170._12_4_ = auVar36._12_4_ * fVar200;
  auVar35 = vfmadd231ps_fma(auVar170,(undefined1  [16])aVar4,auVar35);
  auVar43 = vfmadd231ps_fma(auVar35,(undefined1  [16])aVar3,auVar180);
  auVar36 = vsubps_avx512vl(_local_218,(undefined1  [16])aVar2);
  uVar89 = auVar36._0_4_;
  auVar189._4_4_ = uVar89;
  auVar189._0_4_ = uVar89;
  auVar189._8_4_ = uVar89;
  auVar189._12_4_ = uVar89;
  auVar35 = vshufps_avx(auVar36,auVar36,0x55);
  auVar36 = vshufps_avx(auVar36,auVar36,0xaa);
  auVar181._0_4_ = auVar36._0_4_ * fVar204;
  auVar181._4_4_ = auVar36._4_4_ * fVar188;
  auVar181._8_4_ = auVar36._8_4_ * fVar199;
  auVar181._12_4_ = auVar36._12_4_ * fVar200;
  auVar35 = vfmadd231ps_fma(auVar181,(undefined1  [16])aVar4,auVar35);
  auVar45 = vfmadd231ps_fma(auVar35,(undefined1  [16])aVar3,auVar189);
  auVar36 = vsubps_avx512vl(_local_1d8,(undefined1  [16])aVar2);
  uVar89 = auVar36._0_4_;
  auVar190._4_4_ = uVar89;
  auVar190._0_4_ = uVar89;
  auVar190._8_4_ = uVar89;
  auVar190._12_4_ = uVar89;
  auVar35 = vshufps_avx(auVar36,auVar36,0x55);
  auVar36 = vshufps_avx(auVar36,auVar36,0xaa);
  auVar123._0_4_ = fVar204 * auVar36._0_4_;
  auVar123._4_4_ = fVar188 * auVar36._4_4_;
  auVar123._8_4_ = fVar199 * auVar36._8_4_;
  auVar123._12_4_ = fVar200 * auVar36._12_4_;
  auVar35 = vfmadd231ps_fma(auVar123,(undefined1  [16])aVar4,auVar35);
  auVar46 = vfmadd231ps_fma(auVar35,(undefined1  [16])aVar3,auVar190);
  local_278 = vmovlhps_avx(auVar44,auVar42);
  local_288 = vmovlhps_avx512f(auVar40,auVar43);
  local_298 = vmovlhps_avx512f(auVar39,auVar45);
  _local_f8 = vmovlhps_avx512f(auVar41,auVar46);
  auVar35 = vminps_avx512vl(local_278,local_288);
  auVar37 = vmaxps_avx512vl(local_278,local_288);
  auVar36 = vminps_avx512vl(local_298,_local_f8);
  auVar36 = vminps_avx(auVar35,auVar36);
  auVar35 = vmaxps_avx512vl(local_298,_local_f8);
  auVar35 = vmaxps_avx(auVar37,auVar35);
  auVar37 = vshufpd_avx(auVar36,auVar36,3);
  auVar38 = vshufpd_avx(auVar35,auVar35,3);
  auVar36 = vminps_avx(auVar36,auVar37);
  auVar35 = vmaxps_avx(auVar35,auVar38);
  auVar36 = vandps_avx512vl(auVar36,auVar235._0_16_);
  auVar35 = vandps_avx512vl(auVar35,auVar235._0_16_);
  auVar35 = vmaxps_avx(auVar36,auVar35);
  auVar36 = vmovshdup_avx(auVar35);
  auVar35 = vmaxss_avx(auVar36,auVar35);
  local_328 = uVar28 + 0xf;
  local_2a8._8_8_ = auVar44._0_8_;
  local_2a8._0_8_ = auVar44._0_8_;
  local_2b8._8_8_ = auVar40._0_8_;
  local_2b8._0_8_ = auVar40._0_8_;
  local_2c8 = vmovddup_avx512vl(auVar39);
  local_2d8 = vmovddup_avx512vl(auVar41);
  register0x00001348 = auVar42._0_8_;
  local_2e8 = auVar42._0_8_;
  register0x00001388 = auVar43._0_8_;
  local_2f8 = auVar43._0_8_;
  register0x00001408 = auVar45._0_8_;
  local_308 = auVar45._0_8_;
  register0x00001448 = auVar46._0_8_;
  local_318 = auVar46._0_8_;
  local_108 = ZEXT416((uint)(auVar35._0_4_ * 9.536743e-07));
  local_b8 = vbroadcastss_avx512vl(local_108);
  auVar13._8_4_ = 0x80000000;
  auVar13._0_8_ = 0x8000000080000000;
  auVar13._12_4_ = 0x80000000;
  auVar35 = vxorps_avx512vl(local_b8._0_16_,auVar13);
  local_78 = auVar35._0_4_;
  uStack_74 = local_78;
  uStack_70 = local_78;
  uStack_6c = local_78;
  uStack_68 = local_78;
  uStack_64 = local_78;
  uStack_60 = local_78;
  uStack_5c = local_78;
  local_c8 = vsubps_avx512vl(local_288,local_278);
  local_d8 = vsubps_avx512vl(local_298,local_288);
  local_e8 = vsubps_avx512vl(_local_f8,local_298);
  local_128 = vsubps_avx(_local_1b8,local_1a8);
  local_138 = vsubps_avx512vl(_local_208,local_1e8);
  local_148 = vsubps_avx512vl(_local_218,local_1f8);
  _local_158 = vsubps_avx512vl(_local_1d8,local_1c8);
  bVar29 = false;
  auVar35 = ZEXT816(0x3f80000000000000);
  uVar23 = 0;
  local_320 = context;
  auVar105 = auVar35;
LAB_017da2a8:
  auVar238 = ZEXT3264(local_b8);
  auVar36 = vshufps_avx(auVar105,auVar105,0x50);
  auVar221._8_4_ = 0x3f800000;
  auVar221._0_8_ = 0x3f8000003f800000;
  auVar221._12_4_ = 0x3f800000;
  auVar224._16_4_ = 0x3f800000;
  auVar224._0_16_ = auVar221;
  auVar224._20_4_ = 0x3f800000;
  auVar224._24_4_ = 0x3f800000;
  auVar224._28_4_ = 0x3f800000;
  auVar37 = vsubps_avx(auVar221,auVar36);
  fVar204 = auVar36._0_4_;
  auVar124._0_4_ = local_2e8._0_4_ * fVar204;
  fVar188 = auVar36._4_4_;
  auVar124._4_4_ = local_2e8._4_4_ * fVar188;
  fVar199 = auVar36._8_4_;
  auVar124._8_4_ = local_2e8._8_4_ * fVar199;
  fVar200 = auVar36._12_4_;
  auVar124._12_4_ = local_2e8._12_4_ * fVar200;
  auVar133._0_4_ = local_2f8._0_4_ * fVar204;
  auVar133._4_4_ = local_2f8._4_4_ * fVar188;
  auVar133._8_4_ = local_2f8._8_4_ * fVar199;
  auVar133._12_4_ = local_2f8._12_4_ * fVar200;
  auVar145._0_4_ = local_308._0_4_ * fVar204;
  auVar145._4_4_ = local_308._4_4_ * fVar188;
  auVar145._8_4_ = local_308._8_4_ * fVar199;
  auVar145._12_4_ = local_308._12_4_ * fVar200;
  auVar109._0_4_ = local_318._0_4_ * fVar204;
  auVar109._4_4_ = local_318._4_4_ * fVar188;
  auVar109._8_4_ = local_318._8_4_ * fVar199;
  auVar109._12_4_ = local_318._12_4_ * fVar200;
  auVar38 = vfmadd231ps_fma(auVar124,auVar37,local_2a8);
  auVar44 = vfmadd231ps_fma(auVar133,auVar37,local_2b8);
  auVar40 = vfmadd231ps_avx512vl(auVar145,auVar37,local_2c8);
  auVar37 = vfmadd231ps_avx512vl(auVar109,local_2d8,auVar37);
  auVar36 = vmovshdup_avx(auVar35);
  fVar188 = auVar35._0_4_;
  fVar204 = (auVar36._0_4_ - fVar188) * 0.04761905;
  auVar69._4_4_ = fVar188;
  auVar69._0_4_ = fVar188;
  auVar69._8_4_ = fVar188;
  auVar69._12_4_ = fVar188;
  auVar69._16_4_ = fVar188;
  auVar69._20_4_ = fVar188;
  auVar69._24_4_ = fVar188;
  auVar69._28_4_ = fVar188;
  auVar64._0_8_ = auVar36._0_8_;
  auVar64._8_8_ = auVar64._0_8_;
  auVar64._16_8_ = auVar64._0_8_;
  auVar64._24_8_ = auVar64._0_8_;
  auVar72 = vsubps_avx(auVar64,auVar69);
  uVar89 = auVar38._0_4_;
  auVar74._4_4_ = uVar89;
  auVar74._0_4_ = uVar89;
  auVar74._8_4_ = uVar89;
  auVar74._12_4_ = uVar89;
  auVar74._16_4_ = uVar89;
  auVar74._20_4_ = uVar89;
  auVar74._24_4_ = uVar89;
  auVar74._28_4_ = uVar89;
  auVar127._8_4_ = 1;
  auVar127._0_8_ = 0x100000001;
  auVar127._12_4_ = 1;
  auVar127._16_4_ = 1;
  auVar127._20_4_ = 1;
  auVar127._24_4_ = 1;
  auVar127._28_4_ = 1;
  auVar71 = ZEXT1632(auVar38);
  auVar70 = vpermps_avx2(auVar127,auVar71);
  auVar55 = vbroadcastss_avx512vl(auVar44);
  auVar65 = ZEXT1632(auVar44);
  auVar56 = vpermps_avx512vl(auVar127,auVar65);
  auVar57 = vbroadcastss_avx512vl(auVar40);
  auVar66 = ZEXT1632(auVar40);
  auVar58 = vpermps_avx512vl(auVar127,auVar66);
  auVar59 = vbroadcastss_avx512vl(auVar37);
  auVar68 = ZEXT1632(auVar37);
  auVar60 = vpermps_avx512vl(auVar127,auVar68);
  auVar139._4_4_ = fVar204;
  auVar139._0_4_ = fVar204;
  auVar139._8_4_ = fVar204;
  auVar139._12_4_ = fVar204;
  auVar139._16_4_ = fVar204;
  auVar139._20_4_ = fVar204;
  auVar139._24_4_ = fVar204;
  auVar139._28_4_ = fVar204;
  auVar67._8_4_ = 2;
  auVar67._0_8_ = 0x200000002;
  auVar67._12_4_ = 2;
  auVar67._16_4_ = 2;
  auVar67._20_4_ = 2;
  auVar67._24_4_ = 2;
  auVar67._28_4_ = 2;
  auVar61 = vpermps_avx512vl(auVar67,auVar71);
  auVar62 = vbroadcastss_avx512vl(ZEXT416(3));
  auVar63 = vpermps_avx512vl(auVar62,auVar71);
  auVar64 = vpermps_avx512vl(auVar67,auVar65);
  auVar65 = vpermps_avx512vl(auVar62,auVar65);
  auVar71 = vpermps_avx2(auVar67,auVar66);
  auVar66 = vpermps_avx512vl(auVar62,auVar66);
  auVar67 = vpermps_avx512vl(auVar67,auVar68);
  auVar68 = vpermps_avx512vl(auVar62,auVar68);
  auVar36 = vfmadd132ps_fma(auVar72,auVar69,_DAT_01f7b040);
  auVar72 = vsubps_avx(auVar224,ZEXT1632(auVar36));
  auVar62 = vmulps_avx512vl(auVar55,ZEXT1632(auVar36));
  auVar73 = ZEXT1632(auVar36);
  auVar69 = vmulps_avx512vl(auVar56,auVar73);
  auVar37 = vfmadd231ps_fma(auVar62,auVar72,auVar74);
  auVar38 = vfmadd231ps_fma(auVar69,auVar72,auVar70);
  auVar62 = vmulps_avx512vl(auVar57,auVar73);
  auVar69 = vmulps_avx512vl(auVar58,auVar73);
  auVar55 = vfmadd231ps_avx512vl(auVar62,auVar72,auVar55);
  auVar56 = vfmadd231ps_avx512vl(auVar69,auVar72,auVar56);
  auVar62 = vmulps_avx512vl(auVar59,auVar73);
  auVar74 = ZEXT1632(auVar36);
  auVar60 = vmulps_avx512vl(auVar60,auVar74);
  auVar62 = vfmadd231ps_avx512vl(auVar62,auVar72,auVar57);
  auVar69 = vfmadd231ps_avx512vl(auVar60,auVar72,auVar58);
  fVar199 = auVar36._0_4_;
  fVar200 = auVar36._4_4_;
  auVar57._4_4_ = fVar200 * auVar55._4_4_;
  auVar57._0_4_ = fVar199 * auVar55._0_4_;
  fVar201 = auVar36._8_4_;
  auVar57._8_4_ = fVar201 * auVar55._8_4_;
  fVar202 = auVar36._12_4_;
  auVar57._12_4_ = fVar202 * auVar55._12_4_;
  auVar57._16_4_ = auVar55._16_4_ * 0.0;
  auVar57._20_4_ = auVar55._20_4_ * 0.0;
  auVar57._24_4_ = auVar55._24_4_ * 0.0;
  auVar57._28_4_ = fVar188;
  auVar58._4_4_ = fVar200 * auVar56._4_4_;
  auVar58._0_4_ = fVar199 * auVar56._0_4_;
  auVar58._8_4_ = fVar201 * auVar56._8_4_;
  auVar58._12_4_ = fVar202 * auVar56._12_4_;
  auVar58._16_4_ = auVar56._16_4_ * 0.0;
  auVar58._20_4_ = auVar56._20_4_ * 0.0;
  auVar58._24_4_ = auVar56._24_4_ * 0.0;
  auVar58._28_4_ = auVar70._28_4_;
  auVar37 = vfmadd231ps_fma(auVar57,auVar72,ZEXT1632(auVar37));
  auVar38 = vfmadd231ps_fma(auVar58,auVar72,ZEXT1632(auVar38));
  auVar73._0_4_ = fVar199 * auVar62._0_4_;
  auVar73._4_4_ = fVar200 * auVar62._4_4_;
  auVar73._8_4_ = fVar201 * auVar62._8_4_;
  auVar73._12_4_ = fVar202 * auVar62._12_4_;
  auVar73._16_4_ = auVar62._16_4_ * 0.0;
  auVar73._20_4_ = auVar62._20_4_ * 0.0;
  auVar73._24_4_ = auVar62._24_4_ * 0.0;
  auVar73._28_4_ = 0;
  auVar60._4_4_ = fVar200 * auVar69._4_4_;
  auVar60._0_4_ = fVar199 * auVar69._0_4_;
  auVar60._8_4_ = fVar201 * auVar69._8_4_;
  auVar60._12_4_ = fVar202 * auVar69._12_4_;
  auVar60._16_4_ = auVar69._16_4_ * 0.0;
  auVar60._20_4_ = auVar69._20_4_ * 0.0;
  auVar60._24_4_ = auVar69._24_4_ * 0.0;
  auVar60._28_4_ = auVar62._28_4_;
  auVar44 = vfmadd231ps_fma(auVar73,auVar72,auVar55);
  auVar40 = vfmadd231ps_fma(auVar60,auVar72,auVar56);
  auVar62._28_4_ = auVar56._28_4_;
  auVar62._0_28_ =
       ZEXT1628(CONCAT412(fVar202 * auVar40._12_4_,
                          CONCAT48(fVar201 * auVar40._8_4_,
                                   CONCAT44(fVar200 * auVar40._4_4_,fVar199 * auVar40._0_4_))));
  auVar39 = vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar202 * auVar44._12_4_,
                                               CONCAT48(fVar201 * auVar44._8_4_,
                                                        CONCAT44(fVar200 * auVar44._4_4_,
                                                                 fVar199 * auVar44._0_4_)))),auVar72
                            ,ZEXT1632(auVar37));
  auVar41 = vfmadd231ps_fma(auVar62,auVar72,ZEXT1632(auVar38));
  auVar70 = vsubps_avx(ZEXT1632(auVar44),ZEXT1632(auVar37));
  auVar55 = vsubps_avx(ZEXT1632(auVar40),ZEXT1632(auVar38));
  auVar56 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
  auVar70 = vmulps_avx512vl(auVar70,auVar56);
  auVar55 = vmulps_avx512vl(auVar55,auVar56);
  auVar75._0_4_ = fVar204 * auVar70._0_4_;
  auVar75._4_4_ = fVar204 * auVar70._4_4_;
  auVar75._8_4_ = fVar204 * auVar70._8_4_;
  auVar75._12_4_ = fVar204 * auVar70._12_4_;
  auVar75._16_4_ = fVar204 * auVar70._16_4_;
  auVar75._20_4_ = fVar204 * auVar70._20_4_;
  auVar75._24_4_ = fVar204 * auVar70._24_4_;
  auVar75._28_4_ = 0;
  auVar70 = vmulps_avx512vl(auVar139,auVar55);
  auVar38 = vxorps_avx512vl(auVar59._0_16_,auVar59._0_16_);
  auVar57 = vpermt2ps_avx512vl(ZEXT1632(auVar39),_DAT_01fb9fc0,ZEXT1632(auVar38));
  auVar58 = vpermt2ps_avx512vl(ZEXT1632(auVar41),_DAT_01fb9fc0,ZEXT1632(auVar38));
  auVar114._0_4_ = auVar75._0_4_ + auVar39._0_4_;
  auVar114._4_4_ = auVar75._4_4_ + auVar39._4_4_;
  auVar114._8_4_ = auVar75._8_4_ + auVar39._8_4_;
  auVar114._12_4_ = auVar75._12_4_ + auVar39._12_4_;
  auVar114._16_4_ = auVar75._16_4_ + 0.0;
  auVar114._20_4_ = auVar75._20_4_ + 0.0;
  auVar114._24_4_ = auVar75._24_4_ + 0.0;
  auVar114._28_4_ = 0;
  auVar69 = ZEXT1632(auVar38);
  auVar55 = vpermt2ps_avx512vl(auVar75,_DAT_01fb9fc0,auVar69);
  auVar60 = vaddps_avx512vl(ZEXT1632(auVar41),auVar70);
  auVar62 = vpermt2ps_avx512vl(auVar70,_DAT_01fb9fc0,auVar69);
  auVar70 = vsubps_avx(auVar57,auVar55);
  auVar62 = vsubps_avx512vl(auVar58,auVar62);
  auVar55 = vmulps_avx512vl(auVar64,auVar74);
  auVar59 = vmulps_avx512vl(auVar65,auVar74);
  auVar55 = vfmadd231ps_avx512vl(auVar55,auVar72,auVar61);
  auVar59 = vfmadd231ps_avx512vl(auVar59,auVar72,auVar63);
  auVar61 = vmulps_avx512vl(auVar71,auVar74);
  auVar63 = vmulps_avx512vl(auVar66,auVar74);
  auVar61 = vfmadd231ps_avx512vl(auVar61,auVar72,auVar64);
  auVar63 = vfmadd231ps_avx512vl(auVar63,auVar72,auVar65);
  auVar64 = vmulps_avx512vl(auVar67,auVar74);
  auVar65 = vmulps_avx512vl(auVar68,auVar74);
  auVar37 = vfmadd231ps_fma(auVar64,auVar72,auVar71);
  auVar71 = vfmadd231ps_avx512vl(auVar65,auVar72,auVar66);
  auVar64 = vmulps_avx512vl(auVar74,auVar61);
  auVar67 = ZEXT1632(auVar36);
  auVar65 = vmulps_avx512vl(auVar67,auVar63);
  auVar55 = vfmadd231ps_avx512vl(auVar64,auVar72,auVar55);
  auVar64 = vfmadd231ps_avx512vl(auVar65,auVar72,auVar59);
  auVar71 = vmulps_avx512vl(auVar67,auVar71);
  auVar61 = vfmadd231ps_avx512vl
                      (ZEXT1632(CONCAT412(fVar202 * auVar37._12_4_,
                                          CONCAT48(fVar201 * auVar37._8_4_,
                                                   CONCAT44(fVar200 * auVar37._4_4_,
                                                            fVar199 * auVar37._0_4_)))),auVar72,
                       auVar61);
  auVar71 = vfmadd231ps_avx512vl(auVar71,auVar72,auVar63);
  auVar59._4_4_ = fVar200 * auVar61._4_4_;
  auVar59._0_4_ = fVar199 * auVar61._0_4_;
  auVar59._8_4_ = fVar201 * auVar61._8_4_;
  auVar59._12_4_ = fVar202 * auVar61._12_4_;
  auVar59._16_4_ = auVar61._16_4_ * 0.0;
  auVar59._20_4_ = auVar61._20_4_ * 0.0;
  auVar59._24_4_ = auVar61._24_4_ * 0.0;
  auVar59._28_4_ = auVar66._28_4_;
  auVar63 = vmulps_avx512vl(auVar67,auVar71);
  auVar59 = vfmadd231ps_avx512vl(auVar59,auVar72,auVar55);
  auVar65 = vfmadd231ps_avx512vl(auVar63,auVar64,auVar72);
  auVar72 = vsubps_avx512vl(auVar61,auVar55);
  auVar55 = vsubps_avx512vl(auVar71,auVar64);
  auVar72 = vmulps_avx512vl(auVar72,auVar56);
  auVar55 = vmulps_avx512vl(auVar55,auVar56);
  fVar188 = fVar204 * auVar72._0_4_;
  fVar199 = fVar204 * auVar72._4_4_;
  auVar61._4_4_ = fVar199;
  auVar61._0_4_ = fVar188;
  fVar200 = fVar204 * auVar72._8_4_;
  auVar61._8_4_ = fVar200;
  fVar201 = fVar204 * auVar72._12_4_;
  auVar61._12_4_ = fVar201;
  fVar202 = fVar204 * auVar72._16_4_;
  auVar61._16_4_ = fVar202;
  fVar203 = fVar204 * auVar72._20_4_;
  auVar61._20_4_ = fVar203;
  fVar204 = fVar204 * auVar72._24_4_;
  auVar61._24_4_ = fVar204;
  auVar61._28_4_ = auVar72._28_4_;
  auVar55 = vmulps_avx512vl(auVar139,auVar55);
  auVar71 = vpermt2ps_avx512vl(auVar59,_DAT_01fb9fc0,auVar69);
  auVar56 = vpermt2ps_avx512vl(auVar65,_DAT_01fb9fc0,auVar69);
  auVar184._0_4_ = auVar59._0_4_ + fVar188;
  auVar184._4_4_ = auVar59._4_4_ + fVar199;
  auVar184._8_4_ = auVar59._8_4_ + fVar200;
  auVar184._12_4_ = auVar59._12_4_ + fVar201;
  auVar184._16_4_ = auVar59._16_4_ + fVar202;
  auVar184._20_4_ = auVar59._20_4_ + fVar203;
  auVar184._24_4_ = auVar59._24_4_ + fVar204;
  auVar184._28_4_ = auVar59._28_4_ + auVar72._28_4_;
  auVar72 = vpermt2ps_avx512vl(auVar61,_DAT_01fb9fc0,ZEXT1632(auVar38));
  auVar61 = vaddps_avx512vl(auVar65,auVar55);
  auVar63 = vpermt2ps_avx512vl(auVar55,_DAT_01fb9fc0,ZEXT1632(auVar38));
  auVar55 = vsubps_avx(auVar71,auVar72);
  auVar64 = vsubps_avx512vl(auVar56,auVar63);
  in_ZMM17 = ZEXT3264(auVar64);
  auVar127 = ZEXT1632(auVar39);
  auVar72 = vsubps_avx512vl(auVar59,auVar127);
  auVar139 = ZEXT1632(auVar41);
  auVar63 = vsubps_avx512vl(auVar65,auVar139);
  auVar66 = vsubps_avx512vl(auVar71,auVar57);
  auVar72 = vaddps_avx512vl(auVar72,auVar66);
  auVar66 = vsubps_avx512vl(auVar56,auVar58);
  auVar63 = vaddps_avx512vl(auVar63,auVar66);
  auVar66 = vmulps_avx512vl(auVar139,auVar72);
  auVar66 = vfnmadd231ps_avx512vl(auVar66,auVar127,auVar63);
  auVar67 = vmulps_avx512vl(auVar60,auVar72);
  auVar67 = vfnmadd231ps_avx512vl(auVar67,auVar114,auVar63);
  auVar68 = vmulps_avx512vl(auVar62,auVar72);
  auVar68 = vfnmadd231ps_avx512vl(auVar68,auVar70,auVar63);
  auVar69 = vmulps_avx512vl(auVar58,auVar72);
  auVar69 = vfnmadd231ps_avx512vl(auVar69,auVar57,auVar63);
  auVar73 = vmulps_avx512vl(auVar65,auVar72);
  auVar73 = vfnmadd231ps_avx512vl(auVar73,auVar59,auVar63);
  auVar74 = vmulps_avx512vl(auVar61,auVar72);
  auVar74 = vfnmadd231ps_avx512vl(auVar74,auVar184,auVar63);
  auVar75 = vmulps_avx512vl(auVar64,auVar72);
  auVar75 = vfnmadd231ps_avx512vl(auVar75,auVar55,auVar63);
  auVar72 = vmulps_avx512vl(auVar56,auVar72);
  auVar72 = vfnmadd231ps_avx512vl(auVar72,auVar71,auVar63);
  auVar63 = vminps_avx512vl(auVar66,auVar67);
  auVar66 = vmaxps_avx512vl(auVar66,auVar67);
  auVar67 = vminps_avx512vl(auVar68,auVar69);
  auVar63 = vminps_avx512vl(auVar63,auVar67);
  auVar67 = vmaxps_avx512vl(auVar68,auVar69);
  auVar66 = vmaxps_avx512vl(auVar66,auVar67);
  auVar67 = vminps_avx512vl(auVar73,auVar74);
  auVar68 = vmaxps_avx512vl(auVar73,auVar74);
  auVar69 = vminps_avx512vl(auVar75,auVar72);
  auVar67 = vminps_avx512vl(auVar67,auVar69);
  auVar63 = vminps_avx512vl(auVar63,auVar67);
  auVar72 = vmaxps_avx512vl(auVar75,auVar72);
  auVar72 = vmaxps_avx512vl(auVar68,auVar72);
  auVar72 = vmaxps_avx512vl(auVar66,auVar72);
  auVar231 = ZEXT3264(auVar72);
  uVar11 = vcmpps_avx512vl(auVar63,local_b8,2);
  auVar63._4_4_ = uStack_74;
  auVar63._0_4_ = local_78;
  auVar63._8_4_ = uStack_70;
  auVar63._12_4_ = uStack_6c;
  auVar63._16_4_ = uStack_68;
  auVar63._20_4_ = uStack_64;
  auVar63._24_4_ = uStack_60;
  auVar63._28_4_ = uStack_5c;
  uVar12 = vcmpps_avx512vl(auVar72,auVar63,5);
  bVar21 = (byte)uVar11 & (byte)uVar12 & 0x7f;
  auVar72 = _DAT_01fb9fe0;
  if (bVar21 == 0) {
    auVar70 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
    auVar232 = ZEXT3264(auVar70);
    auVar35 = vbroadcastss_avx512vl(ZEXT416(0x3e124925));
    auVar233 = ZEXT1664(auVar35);
    auVar234 = ZEXT3264(_DAT_01fb9fe0);
  }
  else {
    auVar66 = vsubps_avx512vl(auVar57,auVar127);
    auVar67 = vsubps_avx512vl(auVar58,auVar139);
    auVar68 = vsubps_avx512vl(auVar71,auVar59);
    auVar66 = vaddps_avx512vl(auVar66,auVar68);
    auVar231 = ZEXT3264(auVar66);
    auVar68 = vsubps_avx512vl(auVar56,auVar65);
    auVar67 = vaddps_avx512vl(auVar67,auVar68);
    auVar68 = vmulps_avx512vl(auVar139,auVar66);
    auVar68 = vfnmadd231ps_avx512vl(auVar68,auVar67,auVar127);
    auVar60 = vmulps_avx512vl(auVar60,auVar66);
    auVar60 = vfnmadd213ps_avx512vl(auVar114,auVar67,auVar60);
    auVar62 = vmulps_avx512vl(auVar62,auVar66);
    auVar62 = vfnmadd213ps_avx512vl(auVar70,auVar67,auVar62);
    auVar70 = vmulps_avx512vl(auVar58,auVar66);
    auVar57 = vfnmadd231ps_avx512vl(auVar70,auVar67,auVar57);
    auVar70 = vmulps_avx512vl(auVar65,auVar66);
    auVar58 = vfnmadd231ps_avx512vl(auVar70,auVar67,auVar59);
    auVar70 = vmulps_avx512vl(auVar61,auVar66);
    auVar59 = vfnmadd213ps_avx512vl(auVar184,auVar67,auVar70);
    auVar70 = vmulps_avx512vl(auVar64,auVar66);
    auVar61 = vfnmadd213ps_avx512vl(auVar55,auVar67,auVar70);
    auVar70 = vmulps_avx512vl(auVar56,auVar66);
    auVar64 = vfnmadd231ps_avx512vl(auVar70,auVar71,auVar67);
    auVar55 = vminps_avx(auVar68,auVar60);
    auVar70 = vmaxps_avx(auVar68,auVar60);
    auVar71 = vminps_avx(auVar62,auVar57);
    auVar71 = vminps_avx(auVar55,auVar71);
    auVar55 = vmaxps_avx(auVar62,auVar57);
    auVar70 = vmaxps_avx(auVar70,auVar55);
    auVar56 = vminps_avx(auVar58,auVar59);
    auVar55 = vmaxps_avx(auVar58,auVar59);
    auVar57 = vminps_avx(auVar61,auVar64);
    auVar56 = vminps_avx(auVar56,auVar57);
    auVar56 = vminps_avx(auVar71,auVar56);
    auVar71 = vmaxps_avx(auVar61,auVar64);
    auVar55 = vmaxps_avx(auVar55,auVar71);
    auVar70 = vmaxps_avx(auVar70,auVar55);
    uVar11 = vcmpps_avx512vl(auVar70,auVar63,5);
    uVar12 = vcmpps_avx512vl(auVar56,local_b8,2);
    bVar21 = bVar21 & (byte)uVar11 & (byte)uVar12;
    if (bVar21 != 0) {
      auStack_198[uVar23] = (uint)bVar21;
      uVar11 = vmovlps_avx(auVar35);
      (&uStack_98)[uVar23] = uVar11;
      uVar1 = vmovlps_avx(auVar105);
      auStack_58[uVar23] = uVar1;
      uVar23 = (ulong)((int)uVar23 + 1);
    }
    auVar70 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
    auVar232 = ZEXT3264(auVar70);
    auVar35 = vbroadcastss_avx512vl(ZEXT416(0x3e124925));
    auVar233 = ZEXT1664(auVar35);
    auVar234 = ZEXT3264(_DAT_01fb9fe0);
  }
LAB_017da7ee:
  do {
    do {
      do {
        local_248.valid = &local_330;
        auVar37 = auVar236._0_16_;
        auVar38 = auVar239._0_16_;
        auVar36 = SUB6416(ZEXT464(0xb8d1b717),0);
        if ((int)uVar23 == 0) {
          if (bVar29) goto LAB_017db670;
          fVar204 = ray->tfar;
          auVar19._4_4_ = fVar204;
          auVar19._0_4_ = fVar204;
          auVar19._8_4_ = fVar204;
          auVar19._12_4_ = fVar204;
          uVar11 = vcmpps_avx512vl(local_118,auVar19,2);
          uVar28 = (ulong)((uint)uVar28 & (uint)local_328 & (uint)uVar11);
          context = local_320;
          goto LAB_017d9c2c;
        }
        uVar22 = (int)uVar23 - 1;
        uVar24 = (ulong)uVar22;
        uVar6 = auStack_198[uVar24];
        auVar105._8_8_ = 0;
        auVar105._0_8_ = auStack_58[uVar24];
        uVar1 = 0;
        for (uVar27 = (ulong)uVar6; (uVar27 & 1) == 0; uVar27 = uVar27 >> 1 | 0x8000000000000000) {
          uVar1 = uVar1 + 1;
        }
        uVar26 = uVar6 - 1 & uVar6;
        bVar32 = uVar26 == 0;
        auStack_198[uVar24] = uVar26;
        if (bVar32) {
          uVar23 = (ulong)uVar22;
        }
        auVar93._8_8_ = 0;
        auVar93._0_8_ = uVar1;
        auVar35 = vpunpcklqdq_avx(auVar93,ZEXT416((int)uVar1 + 1));
        auVar35 = vcvtqq2ps_avx512vl(auVar35);
        auVar35 = vmulps_avx512vl(auVar35,auVar233._0_16_);
        uVar89 = *(undefined4 *)((long)&uStack_98 + uVar24 * 8 + 4);
        auVar14._4_4_ = uVar89;
        auVar14._0_4_ = uVar89;
        auVar14._8_4_ = uVar89;
        auVar14._12_4_ = uVar89;
        auVar44 = vmulps_avx512vl(auVar35,auVar14);
        auVar35 = vsubps_avx512vl(auVar37,auVar35);
        uVar89 = *(undefined4 *)(&uStack_98 + uVar24);
        auVar15._4_4_ = uVar89;
        auVar15._0_4_ = uVar89;
        auVar15._8_4_ = uVar89;
        auVar15._12_4_ = uVar89;
        auVar35 = vfmadd231ps_avx512vl(auVar44,auVar35,auVar15);
        auVar44 = vmovshdup_avx(auVar35);
        fVar204 = auVar44._0_4_ - auVar35._0_4_;
        vucomiss_avx512f(ZEXT416((uint)fVar204));
        if (uVar6 == 0 || bVar32) goto LAB_017da2a8;
        auVar44 = vshufps_avx(auVar105,auVar105,0x50);
        vucomiss_avx512f(ZEXT416((uint)fVar204));
        bVar30 = (uint)uVar23 < 4;
        uVar22 = (uint)uVar23 - 4;
        bVar33 = uVar22 == 0;
        bVar31 = (POPCOUNT(uVar22 & 0xff) & 1U) == 0;
        auVar41 = vsubps_avx512vl(auVar37,auVar44);
        fVar188 = auVar44._0_4_;
        auVar134._0_4_ = fVar188 * (float)local_2e8._0_4_;
        fVar199 = auVar44._4_4_;
        auVar134._4_4_ = fVar199 * (float)local_2e8._4_4_;
        fVar200 = auVar44._8_4_;
        auVar134._8_4_ = fVar200 * fStack_2e0;
        fVar201 = auVar44._12_4_;
        auVar134._12_4_ = fVar201 * fStack_2dc;
        auVar146._0_4_ = fVar188 * (float)local_2f8._0_4_;
        auVar146._4_4_ = fVar199 * (float)local_2f8._4_4_;
        auVar146._8_4_ = fVar200 * fStack_2f0;
        auVar146._12_4_ = fVar201 * fStack_2ec;
        auVar152._0_4_ = fVar188 * (float)local_308._0_4_;
        auVar152._4_4_ = fVar199 * (float)local_308._4_4_;
        auVar152._8_4_ = fVar200 * fStack_300;
        auVar152._12_4_ = fVar201 * fStack_2fc;
        auVar116._0_4_ = fVar188 * (float)local_318._0_4_;
        auVar116._4_4_ = fVar199 * (float)local_318._4_4_;
        auVar116._8_4_ = fVar200 * fStack_310;
        auVar116._12_4_ = fVar201 * fStack_30c;
        auVar44 = vfmadd231ps_fma(auVar134,auVar41,local_2a8);
        auVar40 = vfmadd231ps_fma(auVar146,auVar41,local_2b8);
        auVar39 = vfmadd231ps_fma(auVar152,auVar41,local_2c8);
        auVar41 = vfmadd231ps_fma(auVar116,auVar41,local_2d8);
        auVar65._16_16_ = auVar44;
        auVar65._0_16_ = auVar44;
        auVar66._16_16_ = auVar40;
        auVar66._0_16_ = auVar40;
        auVar150._16_16_ = auVar39;
        auVar150._0_16_ = auVar39;
        auVar70 = vpermps_avx512vl(auVar234._0_32_,ZEXT1632(auVar35));
        auVar72 = vsubps_avx(auVar66,auVar65);
        auVar40 = vfmadd213ps_fma(auVar72,auVar70,auVar65);
        auVar72 = vsubps_avx(auVar150,auVar66);
        auVar42 = vfmadd213ps_fma(auVar72,auVar70,auVar66);
        auVar44 = vsubps_avx(auVar41,auVar39);
        auVar68._16_16_ = auVar44;
        auVar68._0_16_ = auVar44;
        auVar44 = vfmadd213ps_fma(auVar68,auVar70,auVar150);
        auVar72 = vsubps_avx(ZEXT1632(auVar42),ZEXT1632(auVar40));
        auVar40 = vfmadd213ps_fma(auVar72,auVar70,ZEXT1632(auVar40));
        auVar72 = vsubps_avx(ZEXT1632(auVar44),ZEXT1632(auVar42));
        auVar44 = vfmadd213ps_fma(auVar72,auVar70,ZEXT1632(auVar42));
        auVar72 = vsubps_avx(ZEXT1632(auVar44),ZEXT1632(auVar40));
        auVar54 = vfmadd231ps_fma(ZEXT1632(auVar40),auVar72,auVar70);
        auVar72 = vmulps_avx512vl(auVar72,auVar232._0_32_);
        auVar44 = vmulss_avx512f(ZEXT416((uint)fVar204),SUB6416(ZEXT464(0x3eaaaaab),0));
        fVar188 = auVar44._0_4_;
        auVar153._0_8_ =
             CONCAT44(auVar54._4_4_ + fVar188 * auVar72._4_4_,
                      auVar54._0_4_ + fVar188 * auVar72._0_4_);
        auVar153._8_4_ = auVar54._8_4_ + fVar188 * auVar72._8_4_;
        auVar153._12_4_ = auVar54._12_4_ + fVar188 * auVar72._12_4_;
        auVar135._0_4_ = fVar188 * auVar72._16_4_;
        auVar135._4_4_ = fVar188 * auVar72._20_4_;
        auVar135._8_4_ = fVar188 * auVar72._24_4_;
        auVar135._12_4_ = fVar188 * auVar72._28_4_;
        auVar47 = vsubps_avx((undefined1  [16])0x0,auVar135);
        auVar42 = vshufpd_avx(auVar54,auVar54,3);
        auVar43 = vshufpd_avx((undefined1  [16])0x0,(undefined1  [16])0x0,3);
        auVar44 = vsubps_avx(auVar42,auVar54);
        auVar40 = vsubps_avx(auVar43,(undefined1  [16])0x0);
        auVar171._0_4_ = auVar44._0_4_ + auVar40._0_4_;
        auVar171._4_4_ = auVar44._4_4_ + auVar40._4_4_;
        auVar171._8_4_ = auVar44._8_4_ + auVar40._8_4_;
        auVar171._12_4_ = auVar44._12_4_ + auVar40._12_4_;
        auVar44 = vshufps_avx(auVar54,auVar54,0xb1);
        auVar40 = vshufps_avx(auVar153,auVar153,0xb1);
        auVar39 = vshufps_avx(auVar47,auVar47,0xb1);
        auVar41 = vshufps_avx((undefined1  [16])0x0,(undefined1  [16])0x0,0xb1);
        auVar222._4_4_ = auVar171._0_4_;
        auVar222._0_4_ = auVar171._0_4_;
        auVar222._8_4_ = auVar171._0_4_;
        auVar222._12_4_ = auVar171._0_4_;
        auVar45 = vshufps_avx(auVar171,auVar171,0x55);
        fVar188 = auVar45._0_4_;
        auVar182._0_4_ = auVar44._0_4_ * fVar188;
        fVar199 = auVar45._4_4_;
        auVar182._4_4_ = auVar44._4_4_ * fVar199;
        fVar200 = auVar45._8_4_;
        auVar182._8_4_ = auVar44._8_4_ * fVar200;
        fVar201 = auVar45._12_4_;
        auVar182._12_4_ = auVar44._12_4_ * fVar201;
        auVar191._0_4_ = auVar40._0_4_ * fVar188;
        auVar191._4_4_ = auVar40._4_4_ * fVar199;
        auVar191._8_4_ = auVar40._8_4_ * fVar200;
        auVar191._12_4_ = auVar40._12_4_ * fVar201;
        auVar207._0_4_ = auVar39._0_4_ * fVar188;
        auVar207._4_4_ = auVar39._4_4_ * fVar199;
        auVar207._8_4_ = auVar39._8_4_ * fVar200;
        auVar207._12_4_ = auVar39._12_4_ * fVar201;
        auVar172._0_4_ = auVar41._0_4_ * fVar188;
        auVar172._4_4_ = auVar41._4_4_ * fVar199;
        auVar172._8_4_ = auVar41._8_4_ * fVar200;
        auVar172._12_4_ = auVar41._12_4_ * fVar201;
        auVar44 = vfmadd231ps_fma(auVar182,auVar222,auVar54);
        auVar40 = vfmadd231ps_fma(auVar191,auVar222,auVar153);
        auVar50 = vfmadd231ps_fma(auVar207,auVar222,auVar47);
        auVar90 = vfmadd231ps_fma(auVar172,(undefined1  [16])0x0,auVar222);
        auVar45 = vshufpd_avx(auVar44,auVar44,1);
        auVar46 = vshufpd_avx(auVar40,auVar40,1);
        auVar48 = vshufpd_avx512vl(auVar50,auVar50,1);
        auVar49 = vshufpd_avx512vl(auVar90,auVar90,1);
        in_ZMM17 = ZEXT1664(auVar49);
        auVar39 = vminss_avx(auVar44,auVar40);
        auVar44 = vmaxss_avx(auVar40,auVar44);
        auVar41 = vminss_avx(auVar50,auVar90);
        auVar40 = vmaxss_avx(auVar90,auVar50);
        auVar39 = vminss_avx(auVar39,auVar41);
        auVar44 = vmaxss_avx(auVar40,auVar44);
        auVar41 = vminss_avx(auVar45,auVar46);
        auVar40 = vmaxss_avx(auVar46,auVar45);
        auVar45 = vminss_avx512f(auVar48,auVar49);
        auVar46 = vmaxss_avx512f(auVar49,auVar48);
        vmaxss_avx(auVar46,auVar40);
        auVar72._0_16_ = vminss_avx512f(auVar41,auVar45);
        vucomiss_avx512f(auVar39);
        if ((!bVar30 && !bVar33) &&
           (auVar40 = vucomiss_avx512f(auVar36), bVar34 = bVar33, !bVar30 && !bVar33)) break;
        auVar40 = vucomiss_avx512f(auVar36);
        auVar41 = vucomiss_avx512f(auVar72._0_16_);
        auVar44 = vucomiss_avx512f(auVar36);
        bVar34 = bVar30 || bVar33;
        bVar31 = bVar30 || bVar33;
        if (!bVar30 && !bVar33) break;
        uVar11 = vcmpps_avx512vl(auVar39,auVar41,5);
        uVar12 = vcmpps_avx512vl(auVar72._0_16_,auVar41,5);
        uVar22 = (uint)uVar11 & (uint)uVar12;
        bVar20 = (uVar22 & 1) == 0;
        bVar34 = (!bVar30 && !bVar33) && bVar20;
        bVar31 = (!bVar30 && !bVar33) && (uVar22 & 1) == 0;
      } while ((bVar30 || bVar33) || !bVar20);
      auVar45 = vxorps_avx512vl(auVar231._0_16_,auVar231._0_16_);
      auVar231 = ZEXT1664(auVar45);
      vcmpss_avx512f(auVar39,auVar45,1);
      uVar11 = vcmpss_avx512f(auVar44,auVar45,1);
      bVar33 = (bool)((byte)uVar11 & 1);
      auVar77._16_16_ = auVar72._16_16_;
      auVar77._0_16_ = auVar237._0_16_;
      auVar76._4_28_ = auVar77._4_28_;
      auVar76._0_4_ = (float)((uint)bVar33 * -0x40800000 + (uint)!bVar33 * auVar237._0_4_);
      vucomiss_avx512f(auVar76._0_16_);
      bVar31 = (bool)(!bVar34 | bVar31);
      bVar34 = bVar31 == false;
      auVar79._16_16_ = auVar72._16_16_;
      auVar79._0_16_ = SUB6416(ZEXT464(0x7f800000),0);
      auVar78._4_28_ = auVar79._4_28_;
      auVar78._0_4_ = (uint)bVar31 * auVar45._0_4_ + (uint)!bVar31 * 0x7f800000;
      auVar41 = auVar78._0_16_;
      auVar81._16_16_ = auVar72._16_16_;
      auVar81._0_16_ = SUB6416(ZEXT464(0xff800000),0);
      auVar80._4_28_ = auVar81._4_28_;
      auVar80._0_4_ = (uint)bVar31 * auVar45._0_4_ + (uint)!bVar31 * -0x800000;
      auVar36 = auVar80._0_16_;
      auVar46 = vxorps_avx512vl(auVar238._0_16_,auVar238._0_16_);
      auVar238 = ZEXT1664(auVar46);
      uVar11 = vcmpss_avx512f(auVar72._0_16_,auVar45,1);
      bVar33 = (bool)((byte)uVar11 & 1);
      auVar83._16_16_ = auVar72._16_16_;
      auVar83._0_16_ = auVar237._0_16_;
      auVar82._4_28_ = auVar83._4_28_;
      auVar82._0_4_ = (float)((uint)bVar33 * -0x40800000 + (uint)!bVar33 * auVar237._0_4_);
      auVar45 = vucomiss_avx512f(auVar82._0_16_);
      in_ZMM17 = ZEXT1664(auVar45);
      if ((bVar31) || (bVar34)) {
        auVar45 = vucomiss_avx512f(auVar39);
        if ((bVar31) || (bVar34)) {
          auVar18._8_4_ = 0x80000000;
          auVar18._0_8_ = 0x8000000080000000;
          auVar18._12_4_ = 0x80000000;
          auVar50 = vxorps_avx512vl(auVar39,auVar18);
          in_ZMM17 = ZEXT1664(auVar50);
          auVar39 = vsubss_avx512f(auVar45,auVar39);
          auVar39 = vdivss_avx512f(auVar50,auVar39);
          auVar45 = vsubss_avx512f(ZEXT416(0x3f800000),auVar39);
          auVar45 = vfmadd213ss_avx512f(auVar45,auVar46,auVar39);
          auVar39 = auVar45;
        }
        else {
          auVar39 = vxorps_avx512vl(auVar45,auVar45);
          vucomiss_avx512f(auVar39);
          auVar45 = ZEXT416(0x3f800000);
          if ((bVar31) || (bVar34)) {
            auVar45 = SUB6416(ZEXT464(0xff800000),0);
            auVar39 = SUB6416(ZEXT464(0x7f800000),0);
          }
        }
        auVar41 = vminss_avx512f(auVar41,auVar39);
        auVar36 = vmaxss_avx(auVar45,auVar36);
      }
      auVar237 = ZEXT464(0x3f800000);
      uVar11 = vcmpss_avx512f(auVar40,auVar46,1);
      bVar31 = (bool)((byte)uVar11 & 1);
      auVar39 = auVar237._0_16_;
      fVar188 = (float)((uint)bVar31 * -0x40800000 + (uint)!bVar31 * 0x3f800000);
      if ((auVar76._0_4_ != fVar188) || (NAN(auVar76._0_4_) || NAN(fVar188))) {
        fVar200 = auVar40._0_4_;
        fVar199 = auVar44._0_4_;
        if ((fVar200 != fVar199) || (NAN(fVar200) || NAN(fVar199))) {
          auVar17._8_4_ = 0x80000000;
          auVar17._0_8_ = 0x8000000080000000;
          auVar17._12_4_ = 0x80000000;
          auVar44 = vxorps_avx512vl(auVar44,auVar17);
          auVar173._0_4_ = auVar44._0_4_ / (fVar200 - fVar199);
          auVar173._4_12_ = auVar44._4_12_;
          auVar44 = vsubss_avx512f(auVar39,auVar173);
          auVar44 = vfmadd213ss_avx512f(auVar44,auVar46,auVar173);
          auVar40 = auVar44;
        }
        else if ((fVar199 != 0.0) || (auVar44 = auVar39, auVar40 = ZEXT816(0) << 0x40, NAN(fVar199))
                ) {
          auVar44 = SUB6416(ZEXT464(0xff800000),0);
          auVar40 = SUB6416(ZEXT464(0x7f800000),0);
        }
        auVar41 = vminss_avx(auVar41,auVar40);
        auVar36 = vmaxss_avx(auVar44,auVar36);
      }
      bVar31 = auVar82._0_4_ != fVar188;
      auVar44 = vminss_avx512f(auVar41,auVar39);
      auVar85._16_16_ = auVar72._16_16_;
      auVar85._0_16_ = auVar41;
      auVar84._4_28_ = auVar85._4_28_;
      auVar84._0_4_ = (uint)bVar31 * auVar44._0_4_ + (uint)!bVar31 * auVar41._0_4_;
      auVar44 = vmaxss_avx512f(auVar39,auVar36);
      auVar87._16_16_ = auVar72._16_16_;
      auVar87._0_16_ = auVar36;
      auVar86._4_28_ = auVar87._4_28_;
      auVar86._0_4_ = (uint)bVar31 * auVar44._0_4_ + (uint)!bVar31 * auVar36._0_4_;
      auVar36 = vmaxss_avx512f(auVar46,auVar84._0_16_);
      auVar72._0_16_ = vminss_avx512f(auVar86._0_16_,auVar39);
    } while (auVar72._0_4_ < auVar36._0_4_);
    auVar41 = vmaxss_avx512f(auVar46,ZEXT416((uint)(auVar36._0_4_ + -0.1)));
    auVar50 = vminss_avx512f(ZEXT416((uint)(auVar72._0_4_ + 0.1)),auVar39);
    auVar117._0_8_ = auVar54._0_8_;
    auVar117._8_8_ = auVar117._0_8_;
    auVar192._8_8_ = auVar153._0_8_;
    auVar192._0_8_ = auVar153._0_8_;
    auVar208._8_8_ = auVar47._0_8_;
    auVar208._0_8_ = auVar47._0_8_;
    auVar36 = vshufpd_avx(auVar153,auVar153,3);
    auVar44 = vshufpd_avx(auVar47,auVar47,3);
    auVar40 = vshufps_avx(auVar41,auVar50,0);
    auVar47 = vsubps_avx512vl(auVar37,auVar40);
    fVar188 = auVar40._0_4_;
    auVar147._0_4_ = fVar188 * auVar42._0_4_;
    fVar199 = auVar40._4_4_;
    auVar147._4_4_ = fVar199 * auVar42._4_4_;
    fVar200 = auVar40._8_4_;
    auVar147._8_4_ = fVar200 * auVar42._8_4_;
    fVar201 = auVar40._12_4_;
    auVar147._12_4_ = fVar201 * auVar42._12_4_;
    auVar154._0_4_ = fVar188 * auVar36._0_4_;
    auVar154._4_4_ = fVar199 * auVar36._4_4_;
    auVar154._8_4_ = fVar200 * auVar36._8_4_;
    auVar154._12_4_ = fVar201 * auVar36._12_4_;
    auVar226._0_4_ = auVar44._0_4_ * fVar188;
    auVar226._4_4_ = auVar44._4_4_ * fVar199;
    auVar226._8_4_ = auVar44._8_4_ * fVar200;
    auVar226._12_4_ = auVar44._12_4_ * fVar201;
    auVar136._0_4_ = fVar188 * auVar43._0_4_;
    auVar136._4_4_ = fVar199 * auVar43._4_4_;
    auVar136._8_4_ = fVar200 * auVar43._8_4_;
    auVar136._12_4_ = fVar201 * auVar43._12_4_;
    auVar42 = vfmadd231ps_fma(auVar147,auVar47,auVar117);
    auVar43 = vfmadd231ps_fma(auVar154,auVar47,auVar192);
    auVar45 = vfmadd231ps_fma(auVar226,auVar47,auVar208);
    auVar47 = vfmadd231ps_fma(auVar136,auVar47,ZEXT816(0));
    auVar44 = vsubss_avx512f(auVar39,auVar41);
    auVar36 = vmovshdup_avx(auVar105);
    auVar48 = vfmadd231ss_fma(ZEXT416((uint)(auVar36._0_4_ * auVar41._0_4_)),auVar105,auVar44);
    auVar44 = vsubss_avx512f(auVar39,auVar50);
    auVar49 = vfmadd231ss_fma(ZEXT416((uint)(auVar36._0_4_ * auVar50._0_4_)),auVar105,auVar44);
    auVar50 = vdivss_avx512f(auVar39,ZEXT416((uint)fVar204));
    auVar36 = vsubps_avx(auVar43,auVar42);
    auVar40 = vmulps_avx512vl(auVar36,auVar38);
    auVar36 = vsubps_avx(auVar45,auVar43);
    auVar41 = vmulps_avx512vl(auVar36,auVar38);
    auVar36 = vsubps_avx(auVar47,auVar45);
    auVar36 = vmulps_avx512vl(auVar36,auVar38);
    auVar44 = vminps_avx(auVar41,auVar36);
    auVar36 = vmaxps_avx(auVar41,auVar36);
    auVar44 = vminps_avx(auVar40,auVar44);
    auVar36 = vmaxps_avx(auVar40,auVar36);
    auVar40 = vshufpd_avx(auVar44,auVar44,3);
    auVar41 = vshufpd_avx(auVar36,auVar36,3);
    auVar44 = vminps_avx(auVar44,auVar40);
    auVar36 = vmaxps_avx(auVar36,auVar41);
    fVar204 = auVar50._0_4_;
    auVar174._0_4_ = auVar44._0_4_ * fVar204;
    auVar174._4_4_ = auVar44._4_4_ * fVar204;
    auVar174._8_4_ = auVar44._8_4_ * fVar204;
    auVar174._12_4_ = auVar44._12_4_ * fVar204;
    auVar163._0_4_ = fVar204 * auVar36._0_4_;
    auVar163._4_4_ = fVar204 * auVar36._4_4_;
    auVar163._8_4_ = fVar204 * auVar36._8_4_;
    auVar163._12_4_ = fVar204 * auVar36._12_4_;
    auVar50 = vdivss_avx512f(auVar39,ZEXT416((uint)(auVar49._0_4_ - auVar48._0_4_)));
    auVar36 = vshufpd_avx(auVar42,auVar42,3);
    auVar44 = vshufpd_avx(auVar43,auVar43,3);
    auVar40 = vshufpd_avx(auVar45,auVar45,3);
    auVar41 = vshufpd_avx(auVar47,auVar47,3);
    auVar36 = vsubps_avx(auVar36,auVar42);
    auVar42 = vsubps_avx(auVar44,auVar43);
    auVar43 = vsubps_avx(auVar40,auVar45);
    auVar41 = vsubps_avx(auVar41,auVar47);
    auVar44 = vminps_avx(auVar36,auVar42);
    auVar36 = vmaxps_avx(auVar36,auVar42);
    auVar40 = vminps_avx(auVar43,auVar41);
    auVar40 = vminps_avx(auVar44,auVar40);
    auVar44 = vmaxps_avx(auVar43,auVar41);
    auVar36 = vmaxps_avx(auVar36,auVar44);
    fVar204 = auVar50._0_4_;
    auVar209._0_4_ = fVar204 * auVar40._0_4_;
    auVar209._4_4_ = fVar204 * auVar40._4_4_;
    auVar209._8_4_ = fVar204 * auVar40._8_4_;
    auVar209._12_4_ = fVar204 * auVar40._12_4_;
    auVar193._0_4_ = fVar204 * auVar36._0_4_;
    auVar193._4_4_ = fVar204 * auVar36._4_4_;
    auVar193._8_4_ = fVar204 * auVar36._8_4_;
    auVar193._12_4_ = fVar204 * auVar36._12_4_;
    auVar41 = vinsertps_avx(auVar35,auVar48,0x10);
    auVar51 = vpermt2ps_avx512vl(auVar35,_DAT_01fb9f90,auVar49);
    auVar106._0_4_ = auVar41._0_4_ + auVar51._0_4_;
    auVar106._4_4_ = auVar41._4_4_ + auVar51._4_4_;
    auVar106._8_4_ = auVar41._8_4_ + auVar51._8_4_;
    auVar106._12_4_ = auVar41._12_4_ + auVar51._12_4_;
    auVar16._8_4_ = 0x3f000000;
    auVar16._0_8_ = 0x3f0000003f000000;
    auVar16._12_4_ = 0x3f000000;
    auVar50 = vmulps_avx512vl(auVar106,auVar16);
    auVar44 = vshufps_avx(auVar50,auVar50,0x54);
    uVar89 = auVar50._0_4_;
    auVar110._4_4_ = uVar89;
    auVar110._0_4_ = uVar89;
    auVar110._8_4_ = uVar89;
    auVar110._12_4_ = uVar89;
    auVar40 = vfmadd213ps_fma(local_c8,auVar110,local_278);
    auVar42 = vfmadd213ps_fma(local_d8,auVar110,local_288);
    auVar43 = vfmadd213ps_fma(local_e8,auVar110,local_298);
    auVar36 = vsubps_avx(auVar42,auVar40);
    auVar40 = vfmadd213ps_fma(auVar36,auVar110,auVar40);
    auVar36 = vsubps_avx(auVar43,auVar42);
    auVar36 = vfmadd213ps_fma(auVar36,auVar110,auVar42);
    auVar36 = vsubps_avx(auVar36,auVar40);
    auVar40 = vfmadd231ps_fma(auVar40,auVar36,auVar110);
    auVar45 = vmulps_avx512vl(auVar36,auVar38);
    auVar218._8_8_ = auVar40._0_8_;
    auVar218._0_8_ = auVar40._0_8_;
    auVar36 = vshufpd_avx(auVar40,auVar40,3);
    auVar40 = vshufps_avx(auVar50,auVar50,0x55);
    auVar42 = vsubps_avx(auVar36,auVar218);
    auVar43 = vfmadd231ps_fma(auVar218,auVar40,auVar42);
    auVar227._8_8_ = auVar45._0_8_;
    auVar227._0_8_ = auVar45._0_8_;
    auVar36 = vshufpd_avx(auVar45,auVar45,3);
    auVar36 = vsubps_avx512vl(auVar36,auVar227);
    auVar36 = vfmadd213ps_avx512vl(auVar36,auVar40,auVar227);
    auVar111._0_8_ = auVar42._0_8_ ^ 0x8000000080000000;
    auVar111._8_4_ = auVar42._8_4_ ^ 0x80000000;
    auVar111._12_4_ = auVar42._12_4_ ^ 0x80000000;
    auVar40 = vmovshdup_avx512vl(auVar36);
    auVar228._0_8_ = auVar40._0_8_ ^ 0x8000000080000000;
    auVar228._8_4_ = auVar40._8_4_ ^ 0x80000000;
    auVar228._12_4_ = auVar40._12_4_ ^ 0x80000000;
    auVar45 = vmovshdup_avx512vl(auVar42);
    auVar231 = ZEXT464(5);
    auVar47 = vpermt2ps_avx512vl(auVar228,ZEXT416(5),auVar42);
    auVar40 = vfmsub231ss_avx512f(ZEXT416((uint)(auVar40._0_4_ * auVar42._0_4_)),auVar36,auVar45);
    auVar42 = vpermt2ps_avx512vl(auVar36,SUB6416(ZEXT464(4),0),auVar111);
    auVar137._0_4_ = auVar40._0_4_;
    auVar137._4_4_ = auVar137._0_4_;
    auVar137._8_4_ = auVar137._0_4_;
    auVar137._12_4_ = auVar137._0_4_;
    auVar36 = vdivps_avx(auVar47,auVar137);
    auVar52 = vdivps_avx512vl(auVar42,auVar137);
    fVar204 = auVar43._0_4_;
    auVar40 = vshufps_avx(auVar43,auVar43,0x55);
    auVar219._0_4_ = fVar204 * auVar36._0_4_ + auVar40._0_4_ * auVar52._0_4_;
    auVar219._4_4_ = fVar204 * auVar36._4_4_ + auVar40._4_4_ * auVar52._4_4_;
    auVar219._8_4_ = fVar204 * auVar36._8_4_ + auVar40._8_4_ * auVar52._8_4_;
    auVar219._12_4_ = fVar204 * auVar36._12_4_ + auVar40._12_4_ * auVar52._12_4_;
    auVar90 = vsubps_avx(auVar44,auVar219);
    auVar40 = vmovshdup_avx(auVar36);
    auVar44 = vinsertps_avx(auVar174,auVar209,0x1c);
    auVar229._0_4_ = auVar40._0_4_ * auVar44._0_4_;
    auVar229._4_4_ = auVar40._4_4_ * auVar44._4_4_;
    auVar229._8_4_ = auVar40._8_4_ * auVar44._8_4_;
    auVar229._12_4_ = auVar40._12_4_ * auVar44._12_4_;
    auVar54 = vinsertps_avx512f(auVar163,auVar193,0x1c);
    auVar40 = vmulps_avx512vl(auVar40,auVar54);
    auVar47 = vminps_avx512vl(auVar229,auVar40);
    auVar43 = vmaxps_avx(auVar40,auVar229);
    auVar45 = vmovshdup_avx(auVar52);
    auVar40 = vinsertps_avx(auVar209,auVar174,0x4c);
    auVar210._0_4_ = auVar45._0_4_ * auVar40._0_4_;
    auVar210._4_4_ = auVar45._4_4_ * auVar40._4_4_;
    auVar210._8_4_ = auVar45._8_4_ * auVar40._8_4_;
    auVar210._12_4_ = auVar45._12_4_ * auVar40._12_4_;
    auVar42 = vinsertps_avx(auVar193,auVar163,0x4c);
    auVar194._0_4_ = auVar45._0_4_ * auVar42._0_4_;
    auVar194._4_4_ = auVar45._4_4_ * auVar42._4_4_;
    auVar194._8_4_ = auVar45._8_4_ * auVar42._8_4_;
    auVar194._12_4_ = auVar45._12_4_ * auVar42._12_4_;
    auVar45 = vminps_avx(auVar210,auVar194);
    auVar47 = vaddps_avx512vl(auVar47,auVar45);
    auVar45 = vmaxps_avx(auVar194,auVar210);
    auVar195._0_4_ = auVar43._0_4_ + auVar45._0_4_;
    auVar195._4_4_ = auVar43._4_4_ + auVar45._4_4_;
    auVar195._8_4_ = auVar43._8_4_ + auVar45._8_4_;
    auVar195._12_4_ = auVar43._12_4_ + auVar45._12_4_;
    auVar211._8_8_ = 0x3f80000000000000;
    auVar211._0_8_ = 0x3f80000000000000;
    auVar43 = vsubps_avx(auVar211,auVar195);
    auVar45 = vsubps_avx(auVar211,auVar47);
    auVar47 = vsubps_avx(auVar41,auVar50);
    auVar50 = vsubps_avx(auVar51,auVar50);
    fVar201 = auVar47._0_4_;
    auVar230._0_4_ = fVar201 * auVar43._0_4_;
    fVar202 = auVar47._4_4_;
    auVar230._4_4_ = fVar202 * auVar43._4_4_;
    fVar203 = auVar47._8_4_;
    auVar230._8_4_ = fVar203 * auVar43._8_4_;
    fVar158 = auVar47._12_4_;
    auVar230._12_4_ = fVar158 * auVar43._12_4_;
    auVar53 = vbroadcastss_avx512vl(auVar36);
    auVar44 = vmulps_avx512vl(auVar53,auVar44);
    auVar54 = vmulps_avx512vl(auVar53,auVar54);
    auVar53 = vminps_avx512vl(auVar44,auVar54);
    auVar54 = vmaxps_avx512vl(auVar54,auVar44);
    auVar44 = vbroadcastss_avx512vl(auVar52);
    auVar40 = vmulps_avx512vl(auVar44,auVar40);
    auVar44 = vmulps_avx512vl(auVar44,auVar42);
    auVar42 = vminps_avx512vl(auVar40,auVar44);
    auVar42 = vaddps_avx512vl(auVar53,auVar42);
    auVar47 = vmulps_avx512vl(auVar47,auVar45);
    in_ZMM17 = ZEXT1664(auVar47);
    fVar204 = auVar50._0_4_;
    auVar196._0_4_ = fVar204 * auVar43._0_4_;
    fVar188 = auVar50._4_4_;
    auVar196._4_4_ = fVar188 * auVar43._4_4_;
    fVar199 = auVar50._8_4_;
    auVar196._8_4_ = fVar199 * auVar43._8_4_;
    fVar200 = auVar50._12_4_;
    auVar196._12_4_ = fVar200 * auVar43._12_4_;
    auVar212._0_4_ = fVar204 * auVar45._0_4_;
    auVar212._4_4_ = fVar188 * auVar45._4_4_;
    auVar212._8_4_ = fVar199 * auVar45._8_4_;
    auVar212._12_4_ = fVar200 * auVar45._12_4_;
    auVar44 = vmaxps_avx(auVar44,auVar40);
    auVar164._0_4_ = auVar54._0_4_ + auVar44._0_4_;
    auVar164._4_4_ = auVar54._4_4_ + auVar44._4_4_;
    auVar164._8_4_ = auVar54._8_4_ + auVar44._8_4_;
    auVar164._12_4_ = auVar54._12_4_ + auVar44._12_4_;
    auVar175._8_8_ = 0x3f800000;
    auVar175._0_8_ = 0x3f800000;
    auVar44 = vsubps_avx(auVar175,auVar164);
    auVar40 = vsubps_avx512vl(auVar175,auVar42);
    auVar223._0_4_ = fVar201 * auVar44._0_4_;
    auVar223._4_4_ = fVar202 * auVar44._4_4_;
    auVar223._8_4_ = fVar203 * auVar44._8_4_;
    auVar223._12_4_ = fVar158 * auVar44._12_4_;
    auVar220._0_4_ = fVar201 * auVar40._0_4_;
    auVar220._4_4_ = fVar202 * auVar40._4_4_;
    auVar220._8_4_ = fVar203 * auVar40._8_4_;
    auVar220._12_4_ = fVar158 * auVar40._12_4_;
    auVar165._0_4_ = fVar204 * auVar44._0_4_;
    auVar165._4_4_ = fVar188 * auVar44._4_4_;
    auVar165._8_4_ = fVar199 * auVar44._8_4_;
    auVar165._12_4_ = fVar200 * auVar44._12_4_;
    auVar176._0_4_ = fVar204 * auVar40._0_4_;
    auVar176._4_4_ = fVar188 * auVar40._4_4_;
    auVar176._8_4_ = fVar199 * auVar40._8_4_;
    auVar176._12_4_ = fVar200 * auVar40._12_4_;
    auVar44 = vminps_avx(auVar223,auVar220);
    auVar40 = vminps_avx512vl(auVar165,auVar176);
    auVar42 = vminps_avx512vl(auVar44,auVar40);
    auVar44 = vmaxps_avx(auVar220,auVar223);
    auVar40 = vmaxps_avx(auVar176,auVar165);
    auVar40 = vmaxps_avx(auVar40,auVar44);
    auVar43 = vminps_avx512vl(auVar230,auVar47);
    auVar44 = vminps_avx(auVar196,auVar212);
    auVar44 = vminps_avx(auVar43,auVar44);
    auVar44 = vhaddps_avx(auVar42,auVar44);
    auVar72._0_16_ = vmaxps_avx512vl(auVar47,auVar230);
    auVar42 = vmaxps_avx(auVar212,auVar196);
    auVar42 = vmaxps_avx(auVar42,auVar72._0_16_);
    auVar40 = vhaddps_avx(auVar40,auVar42);
    auVar44 = vshufps_avx(auVar44,auVar44,0xe8);
    auVar40 = vshufps_avx(auVar40,auVar40,0xe8);
    auVar166._0_4_ = auVar44._0_4_ + auVar90._0_4_;
    auVar166._4_4_ = auVar44._4_4_ + auVar90._4_4_;
    auVar166._8_4_ = auVar44._8_4_ + auVar90._8_4_;
    auVar166._12_4_ = auVar44._12_4_ + auVar90._12_4_;
    auVar177._0_4_ = auVar40._0_4_ + auVar90._0_4_;
    auVar177._4_4_ = auVar40._4_4_ + auVar90._4_4_;
    auVar177._8_4_ = auVar40._8_4_ + auVar90._8_4_;
    auVar177._12_4_ = auVar40._12_4_ + auVar90._12_4_;
    auVar44 = vmaxps_avx(auVar41,auVar166);
    auVar40 = vminps_avx(auVar177,auVar51);
    uVar1 = vcmpps_avx512vl(auVar40,auVar44,1);
  } while ((uVar1 & 3) != 0);
  uVar1 = vcmpps_avx512vl(auVar177,auVar51,1);
  uVar11 = vcmpps_avx512vl(auVar35,auVar166,1);
  if (((ushort)uVar11 & (ushort)uVar1 & 1) == 0) {
    bVar21 = 0;
  }
  else {
    auVar44 = vmovshdup_avx(auVar166);
    bVar21 = auVar48._0_4_ < auVar44._0_4_ & (byte)(uVar1 >> 1) & 0x7f;
  }
  if (((!bVar30 || uVar6 != 0 && !bVar32) | bVar21) != 1) goto LAB_017db5fe;
  lVar25 = 0xc9;
  do {
    lVar25 = lVar25 + -1;
    if (lVar25 == 0) goto LAB_017da7ee;
    auVar35 = vsubss_avx512f(auVar39,auVar90);
    fVar199 = auVar35._0_4_;
    fVar204 = fVar199 * fVar199 * fVar199;
    fVar200 = auVar90._0_4_;
    fVar188 = fVar200 * 3.0 * fVar199 * fVar199;
    fVar199 = fVar199 * fVar200 * fVar200 * 3.0;
    auVar125._4_4_ = fVar204;
    auVar125._0_4_ = fVar204;
    auVar125._8_4_ = fVar204;
    auVar125._12_4_ = fVar204;
    auVar118._4_4_ = fVar188;
    auVar118._0_4_ = fVar188;
    auVar118._8_4_ = fVar188;
    auVar118._12_4_ = fVar188;
    auVar94._4_4_ = fVar199;
    auVar94._0_4_ = fVar199;
    auVar94._8_4_ = fVar199;
    auVar94._12_4_ = fVar199;
    fVar200 = fVar200 * fVar200 * fVar200;
    auVar148._0_4_ = (float)local_f8._0_4_ * fVar200;
    auVar148._4_4_ = (float)local_f8._4_4_ * fVar200;
    auVar148._8_4_ = fStack_f0 * fVar200;
    auVar148._12_4_ = fStack_ec * fVar200;
    auVar35 = vfmadd231ps_fma(auVar148,local_298,auVar94);
    auVar35 = vfmadd231ps_fma(auVar35,local_288,auVar118);
    auVar35 = vfmadd231ps_fma(auVar35,local_278,auVar125);
    auVar95._8_8_ = auVar35._0_8_;
    auVar95._0_8_ = auVar35._0_8_;
    auVar35 = vshufpd_avx(auVar35,auVar35,3);
    auVar44 = vshufps_avx(auVar90,auVar90,0x55);
    auVar35 = vsubps_avx(auVar35,auVar95);
    auVar44 = vfmadd213ps_fma(auVar35,auVar44,auVar95);
    fVar204 = auVar44._0_4_;
    auVar35 = vshufps_avx(auVar44,auVar44,0x55);
    auVar96._0_4_ = auVar36._0_4_ * fVar204 + auVar52._0_4_ * auVar35._0_4_;
    auVar96._4_4_ = auVar36._4_4_ * fVar204 + auVar52._4_4_ * auVar35._4_4_;
    auVar96._8_4_ = auVar36._8_4_ * fVar204 + auVar52._8_4_ * auVar35._8_4_;
    auVar96._12_4_ = auVar36._12_4_ * fVar204 + auVar52._12_4_ * auVar35._12_4_;
    auVar90 = vsubps_avx(auVar90,auVar96);
    auVar35 = vandps_avx512vl(auVar44,auVar235._0_16_);
    auVar72._0_16_ = vprolq_avx512vl(auVar35,0x20);
    auVar35 = vmaxss_avx(auVar72._0_16_,auVar35);
    bVar32 = (float)local_108._0_4_ < auVar35._0_4_;
  } while ((float)local_108._0_4_ <= auVar35._0_4_);
  auVar35 = vucomiss_avx512f(auVar46);
  if (bVar32) goto LAB_017da7ee;
  auVar36 = vucomiss_avx512f(auVar35);
  auVar237 = ZEXT1664(auVar36);
  if (bVar32) goto LAB_017da7ee;
  vmovshdup_avx(auVar35);
  auVar36 = vucomiss_avx512f(auVar46);
  if (bVar32) goto LAB_017da7ee;
  auVar44 = vucomiss_avx512f(auVar36);
  auVar237 = ZEXT1664(auVar44);
  if (bVar32) goto LAB_017da7ee;
  auVar40 = vinsertps_avx(ZEXT416((uint)(pre->ray_space).vx.field_0.m128[2]),
                          ZEXT416((uint)(pre->ray_space).vy.field_0.m128[2]),0x1c);
  auVar47 = vinsertps_avx(auVar40,ZEXT416((uint)(pre->ray_space).vz.field_0.m128[2]),0x28);
  aVar2 = (ray->org).field_0;
  auVar40 = vsubps_avx(local_1a8,(undefined1  [16])aVar2);
  auVar40 = vdpps_avx(auVar40,auVar47,0x7f);
  auVar39 = vsubps_avx(local_1e8,(undefined1  [16])aVar2);
  auVar39 = vdpps_avx(auVar39,auVar47,0x7f);
  auVar41 = vsubps_avx(local_1f8,(undefined1  [16])aVar2);
  auVar41 = vdpps_avx(auVar41,auVar47,0x7f);
  auVar42 = vsubps_avx(local_1c8,(undefined1  [16])aVar2);
  auVar42 = vdpps_avx(auVar42,auVar47,0x7f);
  auVar43 = vsubps_avx(_local_1b8,(undefined1  [16])aVar2);
  auVar43 = vdpps_avx(auVar43,auVar47,0x7f);
  auVar45 = vsubps_avx(_local_208,(undefined1  [16])aVar2);
  auVar45 = vdpps_avx(auVar45,auVar47,0x7f);
  auVar46 = vsubps_avx(_local_218,(undefined1  [16])aVar2);
  auVar46 = vdpps_avx(auVar46,auVar47,0x7f);
  auVar50 = vsubps_avx(_local_1d8,(undefined1  [16])aVar2);
  auVar47 = vdpps_avx(auVar50,auVar47,0x7f);
  auVar50 = vsubss_avx512f(auVar44,auVar36);
  fVar204 = auVar36._0_4_;
  auVar36 = vfmadd231ss_fma(ZEXT416((uint)(auVar43._0_4_ * fVar204)),auVar50,auVar40);
  auVar40 = vfmadd231ss_fma(ZEXT416((uint)(auVar45._0_4_ * fVar204)),auVar50,auVar39);
  auVar39 = vfmadd231ss_fma(ZEXT416((uint)(auVar46._0_4_ * fVar204)),auVar50,auVar41);
  auVar41 = vfmadd231ss_fma(ZEXT416((uint)(fVar204 * auVar47._0_4_)),auVar50,auVar42);
  auVar72._0_16_ = vsubss_avx512f(auVar44,auVar35);
  auVar149._0_4_ = auVar72._0_4_;
  fVar204 = auVar149._0_4_ * auVar149._0_4_ * auVar149._0_4_;
  fVar201 = auVar35._0_4_;
  fVar188 = fVar201 * 3.0 * auVar149._0_4_ * auVar149._0_4_;
  fVar199 = auVar149._0_4_ * fVar201 * fVar201 * 3.0;
  fVar202 = fVar201 * fVar201 * fVar201;
  auVar44 = vfmadd231ss_fma(ZEXT416((uint)(fVar202 * auVar41._0_4_)),ZEXT416((uint)fVar199),auVar39)
  ;
  auVar44 = vfmadd231ss_fma(auVar44,ZEXT416((uint)fVar188),auVar40);
  auVar36 = vfmadd231ss_fma(auVar44,ZEXT416((uint)fVar204),auVar36);
  fVar200 = auVar36._0_4_;
  if ((fVar200 < (ray->org).field_0.m128[3]) || (local_32c = ray->tfar, local_32c < fVar200))
  goto LAB_017da7ee;
  auVar36 = vshufps_avx(auVar35,auVar35,0x55);
  auVar40 = vsubps_avx512vl(auVar37,auVar36);
  fVar203 = auVar36._0_4_;
  auVar178._0_4_ = fVar203 * (float)local_1b8._0_4_;
  fVar158 = auVar36._4_4_;
  auVar178._4_4_ = fVar158 * (float)local_1b8._4_4_;
  fVar88 = auVar36._8_4_;
  auVar178._8_4_ = fVar88 * fStack_1b0;
  fVar97 = auVar36._12_4_;
  auVar178._12_4_ = fVar97 * fStack_1ac;
  auVar183._0_4_ = fVar203 * (float)local_208._0_4_;
  auVar183._4_4_ = fVar158 * (float)local_208._4_4_;
  auVar183._8_4_ = fVar88 * fStack_200;
  auVar183._12_4_ = fVar97 * fStack_1fc;
  auVar197._0_4_ = fVar203 * (float)local_218._0_4_;
  auVar197._4_4_ = fVar158 * (float)local_218._4_4_;
  auVar197._8_4_ = fVar88 * fStack_210;
  auVar197._12_4_ = fVar97 * fStack_20c;
  auVar155._0_4_ = fVar203 * (float)local_1d8._0_4_;
  auVar155._4_4_ = fVar158 * (float)local_1d8._4_4_;
  auVar155._8_4_ = fVar88 * fStack_1d0;
  auVar155._12_4_ = fVar97 * fStack_1cc;
  auVar36 = vfmadd231ps_fma(auVar178,auVar40,local_1a8);
  auVar37 = vfmadd231ps_fma(auVar183,auVar40,local_1e8);
  auVar44 = vfmadd231ps_fma(auVar197,auVar40,local_1f8);
  auVar40 = vfmadd231ps_fma(auVar155,auVar40,local_1c8);
  auVar36 = vsubps_avx(auVar37,auVar36);
  auVar37 = vsubps_avx(auVar44,auVar37);
  auVar44 = vsubps_avx(auVar40,auVar44);
  auVar198._0_4_ = fVar201 * auVar37._0_4_;
  auVar198._4_4_ = fVar201 * auVar37._4_4_;
  auVar198._8_4_ = fVar201 * auVar37._8_4_;
  auVar198._12_4_ = fVar201 * auVar37._12_4_;
  auVar149._4_4_ = auVar149._0_4_;
  auVar149._8_4_ = auVar149._0_4_;
  auVar149._12_4_ = auVar149._0_4_;
  auVar36 = vfmadd231ps_fma(auVar198,auVar149,auVar36);
  auVar156._0_4_ = fVar201 * auVar44._0_4_;
  auVar156._4_4_ = fVar201 * auVar44._4_4_;
  auVar156._8_4_ = fVar201 * auVar44._8_4_;
  auVar156._12_4_ = fVar201 * auVar44._12_4_;
  auVar37 = vfmadd231ps_fma(auVar156,auVar149,auVar37);
  auVar157._0_4_ = fVar201 * auVar37._0_4_;
  auVar157._4_4_ = fVar201 * auVar37._4_4_;
  auVar157._8_4_ = fVar201 * auVar37._8_4_;
  auVar157._12_4_ = fVar201 * auVar37._12_4_;
  auVar36 = vfmadd231ps_fma(auVar157,auVar149,auVar36);
  auVar72._0_16_ = vmulps_avx512vl(auVar36,auVar38);
  pGVar7 = (local_320->scene->geometries).items[uVar5].ptr;
  if ((pGVar7->mask & ray->mask) != 0) {
    if ((local_320->args->filter == (RTCFilterFunctionN)0x0) &&
       (bVar21 = 1, pGVar7->occlusionFilterN == (RTCFilterFunctionN)0x0)) goto LAB_017db5e5;
    auVar138._0_4_ = fVar202 * (float)local_158._0_4_;
    auVar138._4_4_ = fVar202 * (float)local_158._4_4_;
    auVar138._8_4_ = fVar202 * fStack_150;
    auVar138._12_4_ = fVar202 * fStack_14c;
    auVar126._4_4_ = fVar199;
    auVar126._0_4_ = fVar199;
    auVar126._8_4_ = fVar199;
    auVar126._12_4_ = fVar199;
    auVar36 = vfmadd132ps_fma(auVar126,auVar138,local_148);
    auVar119._4_4_ = fVar188;
    auVar119._0_4_ = fVar188;
    auVar119._8_4_ = fVar188;
    auVar119._12_4_ = fVar188;
    auVar36 = vfmadd132ps_fma(auVar119,auVar36,local_138);
    auVar112._4_4_ = fVar204;
    auVar112._0_4_ = fVar204;
    auVar112._8_4_ = fVar204;
    auVar112._12_4_ = fVar204;
    auVar38 = vfmadd132ps_fma(auVar112,auVar36,local_128);
    auVar36 = vshufps_avx(auVar38,auVar38,0xc9);
    auVar37 = vshufps_avx(auVar72._0_16_,auVar72._0_16_,0xc9);
    auVar113._0_4_ = auVar38._0_4_ * auVar37._0_4_;
    auVar113._4_4_ = auVar38._4_4_ * auVar37._4_4_;
    auVar113._8_4_ = auVar38._8_4_ * auVar37._8_4_;
    auVar113._12_4_ = auVar38._12_4_ * auVar37._12_4_;
    auVar37 = vfmsub231ps_fma(auVar113,auVar72._0_16_,auVar36);
    auVar36 = vshufps_avx(auVar37,auVar37,0xe9);
    local_188 = vmovlps_avx(auVar36);
    local_180 = auVar37._0_4_;
    local_17c = vmovlps_avx(auVar35);
    local_174 = (int)local_250;
    local_170 = uVar5;
    local_16c = local_320->user->instID[0];
    local_168 = local_320->user->instPrimID[0];
    ray->tfar = fVar200;
    local_330 = -1;
    local_248.geometryUserPtr = pGVar7->userPtr;
    local_248.context = local_320->user;
    local_248.hit = (RTCHitN *)&local_188;
    local_248.N = 1;
    local_248.ray = (RTCRayN *)ray;
    if (pGVar7->occlusionFilterN == (RTCFilterFunctionN)0x0) {
LAB_017db50b:
      p_Var10 = local_320->args->filter;
      if ((p_Var10 != (RTCFilterFunctionN)0x0) &&
         (((local_320->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
           RTC_RAY_QUERY_FLAG_INCOHERENT || (((pGVar7->field_8).field_0x2 & 0x40) != 0)))) {
        (*p_Var10)(&local_248);
        auVar237 = ZEXT464(0x3f800000);
        auVar234 = ZEXT3264(_DAT_01fb9fe0);
        auVar35 = vbroadcastss_avx512vl(ZEXT416(0x3e124925));
        auVar233 = ZEXT1664(auVar35);
        auVar72 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
        auVar232 = ZEXT3264(auVar72);
        auVar35 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
        auVar239 = ZEXT1664(auVar35);
        auVar35 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
        auVar236 = ZEXT1664(auVar35);
        auVar72._0_16_ = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
        auVar235 = ZEXT1664(auVar72._0_16_);
        if (*local_248.valid == 0) goto LAB_017db5d7;
      }
      bVar21 = 1;
      goto LAB_017db5e5;
    }
    local_260 = prim;
    (*pGVar7->occlusionFilterN)(&local_248);
    auVar237 = ZEXT464(0x3f800000);
    auVar234 = ZEXT3264(_DAT_01fb9fe0);
    auVar35 = vbroadcastss_avx512vl(ZEXT416(0x3e124925));
    auVar233 = ZEXT1664(auVar35);
    auVar72 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
    auVar232 = ZEXT3264(auVar72);
    auVar35 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
    auVar239 = ZEXT1664(auVar35);
    auVar35 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
    auVar236 = ZEXT1664(auVar35);
    auVar72._0_16_ = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
    auVar235 = ZEXT1664(auVar72._0_16_);
    prim = local_260;
    if (*local_248.valid != 0) goto LAB_017db50b;
LAB_017db5d7:
    auVar237 = ZEXT464(0x3f800000);
    ray->tfar = local_32c;
  }
  bVar21 = 0;
LAB_017db5e5:
  bVar29 = (bool)(bVar29 | bVar21);
  pre = local_258;
  goto LAB_017da7ee;
LAB_017db5fe:
  auVar105 = vinsertps_avx(auVar48,auVar49,0x10);
  goto LAB_017da2a8;
}

Assistant:

static __forceinline bool occluded_hn(const Precalculations& pre, Ray& ray, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(shadow.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          Vec3ff p0,t0,p1,t1; Vec3fa n0,dn0,n1,dn1; geom->gather_hermite(p0,t0,n0,dn0,p1,t1,n1,dn1,geom->curve(primID));
          if (Intersector().intersect(pre,ray,context,geom,primID,p0,t0,p1,t1,n0,dn0,n1,dn1,Epilog(ray,context,geomID,primID)))
            return true;
          
          mask &= movemask(tNear <= vfloat<M>(ray.tfar));
        }
        return false;
      }